

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx::SubGridMBIntersectorKPluecker<4,_8,_true>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  ushort uVar1;
  Geometry *pGVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  size_t k;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  byte bVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  uint uVar76;
  uint uVar77;
  uint uVar78;
  uint uVar79;
  uint uVar80;
  uint uVar81;
  uint uVar82;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  ulong *puVar89;
  RayK<8> *pRVar90;
  RayQueryContext *pRVar91;
  int iVar92;
  AABBNodeMB4D *node1;
  ulong uVar93;
  long lVar94;
  long lVar95;
  uint uVar96;
  long lVar97;
  long lVar98;
  long lVar99;
  long lVar100;
  undefined4 uVar101;
  ulong unaff_RBX;
  ulong uVar102;
  ulong uVar103;
  undefined1 (*pauVar104) [32];
  NodeRef NVar105;
  undefined8 in_R11;
  ulong uVar106;
  ulong *puVar107;
  bool bVar108;
  undefined1 auVar109 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar143 [16];
  float fVar138;
  undefined1 auVar144 [32];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float fVar154;
  float fVar156;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar153;
  float fVar155;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar152 [64];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [16];
  undefined1 auVar175 [16];
  float fVar183;
  float fVar185;
  float fVar186;
  float fVar187;
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar184;
  float fVar188;
  undefined1 auVar182 [32];
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar198 [32];
  float fVar202;
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar211;
  float fVar212;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  float fVar232;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  float fVar244;
  float fVar245;
  float fVar249;
  float fVar250;
  undefined1 auVar246 [16];
  float fVar252;
  float fVar253;
  float fVar254;
  undefined1 auVar247 [32];
  float fVar251;
  float fVar255;
  undefined1 auVar248 [32];
  float fVar256;
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar265 [32];
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  undefined1 auVar269 [32];
  undefined1 auVar288 [32];
  float fVar289;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  undefined1 auVar290 [32];
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  Precalculations pre;
  UVIdentity<8> mapUV;
  vbool<8> terminated;
  RTCFilterFunctionNArguments args;
  float old_t;
  vbool<8> valid0;
  TravRayK<8,_true> tray;
  vint<8> itime;
  vfloat<8> ftime;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2f42;
  undefined1 local_2f41;
  undefined1 (*local_2f40) [32];
  NodeRef local_2f38;
  ulong local_2f30;
  ulong *local_2f28;
  uint local_2f1c;
  uint local_2f18;
  uint local_2f14;
  RayK<8> *local_2f10;
  long local_2f08;
  undefined1 local_2f00 [32];
  undefined8 local_2ee0;
  float fStack_2ed8;
  float fStack_2ed4;
  float fStack_2ed0;
  float fStack_2ecc;
  float fStack_2ec8;
  float fStack_2ec4;
  undefined1 local_2ec0 [32];
  undefined1 local_2ea0 [32];
  undefined1 local_2e80 [20];
  uint uStack_2e6c;
  uint uStack_2e68;
  uint uStack_2e64;
  BVH *local_2e48;
  Intersectors *local_2e40;
  long local_2e38;
  long local_2e30;
  ulong local_2e28;
  RayK<8> *local_2e20;
  RayQueryContext *local_2e18;
  ulong local_2e10;
  ulong local_2e08;
  ulong local_2e00;
  long local_2df8;
  long local_2df0;
  Scene *local_2de8;
  undefined1 local_2de0 [16];
  undefined1 local_2dd0 [16];
  undefined8 local_2dc0;
  float fStack_2db8;
  float fStack_2db4;
  float fStack_2db0;
  float fStack_2dac;
  float fStack_2da8;
  float fStack_2da4;
  RTCFilterFunctionNArguments local_2d90;
  undefined1 local_2d60 [32];
  undefined1 local_2d40 [32];
  undefined1 local_2d20 [32];
  undefined1 local_2d00 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2ce0;
  undefined1 local_2c80 [32];
  undefined1 local_2c60 [32];
  undefined1 local_2c40 [32];
  undefined1 local_2c20 [8];
  float fStack_2c18;
  float fStack_2c14;
  float fStack_2c10;
  float fStack_2c0c;
  float fStack_2c08;
  undefined1 local_2c00 [8];
  float fStack_2bf8;
  float fStack_2bf4;
  float fStack_2bf0;
  float fStack_2bec;
  float fStack_2be8;
  undefined1 local_2be0 [8];
  float fStack_2bd8;
  float fStack_2bd4;
  float fStack_2bd0;
  float fStack_2bcc;
  float fStack_2bc8;
  undefined1 local_2bc0 [32];
  undefined1 local_2ba0 [32];
  undefined1 local_2b80 [32];
  undefined1 local_2b60 [32];
  undefined1 local_2b40 [32];
  float local_2b20 [4];
  float fStack_2b10;
  float fStack_2b0c;
  float fStack_2b08;
  float fStack_2b04;
  undefined1 local_2b00 [32];
  undefined1 local_2ae0 [32];
  undefined1 *local_2ac0;
  undefined1 local_2aa0 [32];
  undefined1 local_2a80 [32];
  undefined1 local_2a60 [32];
  undefined1 local_2a40 [32];
  float local_2a20 [4];
  float fStack_2a10;
  float fStack_2a0c;
  float fStack_2a08;
  undefined4 uStack_2a04;
  float local_2a00 [4];
  float fStack_29f0;
  float fStack_29ec;
  float fStack_29e8;
  undefined4 uStack_29e4;
  float local_29e0 [4];
  float fStack_29d0;
  float fStack_29cc;
  float fStack_29c8;
  undefined4 uStack_29c4;
  float local_29c0 [4];
  float fStack_29b0;
  float fStack_29ac;
  float fStack_29a8;
  float fStack_29a4;
  float local_29a0;
  float fStack_299c;
  float fStack_2998;
  float fStack_2994;
  float fStack_2990;
  float fStack_298c;
  float fStack_2988;
  float fStack_2984;
  undefined1 local_2980 [32];
  undefined4 local_2960;
  undefined4 uStack_295c;
  undefined4 uStack_2958;
  undefined4 uStack_2954;
  undefined4 uStack_2950;
  undefined4 uStack_294c;
  undefined4 uStack_2948;
  undefined4 uStack_2944;
  undefined4 local_2940;
  undefined4 uStack_293c;
  undefined4 uStack_2938;
  undefined4 uStack_2934;
  undefined4 uStack_2930;
  undefined4 uStack_292c;
  undefined4 uStack_2928;
  undefined4 uStack_2924;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined1 local_2900 [32];
  uint local_28e0;
  uint uStack_28dc;
  uint uStack_28d8;
  uint uStack_28d4;
  uint uStack_28d0;
  uint uStack_28cc;
  uint uStack_28c8;
  uint uStack_28c4;
  uint local_28c0;
  uint uStack_28bc;
  uint uStack_28b8;
  uint uStack_28b4;
  uint uStack_28b0;
  uint uStack_28ac;
  uint uStack_28a8;
  uint uStack_28a4;
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  float local_2840;
  float fStack_283c;
  float fStack_2838;
  float fStack_2834;
  float fStack_2830;
  float fStack_282c;
  float fStack_2828;
  undefined4 uStack_2824;
  undefined1 local_2820 [8];
  float fStack_2818;
  float fStack_2814;
  float fStack_2810;
  float fStack_280c;
  float fStack_2808;
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [8];
  float fStack_27b8;
  float fStack_27b4;
  float fStack_27b0;
  float fStack_27ac;
  float fStack_27a8;
  undefined1 local_27a0 [8];
  float fStack_2798;
  float fStack_2794;
  float fStack_2790;
  float fStack_278c;
  float fStack_2788;
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined4 local_1e80;
  undefined4 uStack_1e7c;
  undefined4 uStack_1e78;
  undefined4 uStack_1e74;
  undefined4 uStack_1e70;
  undefined4 uStack_1e6c;
  undefined4 uStack_1e68;
  undefined4 uStack_1e64;
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  local_2e48 = (BVH *)This->ptr;
  local_2608 = (local_2e48->root).ptr;
  if (local_2608 != 8) {
    auVar111 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar110 = vpcmpeqd_avx(auVar111,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
    auVar111 = vpcmpeqd_avx(auVar111,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
    auVar161 = ZEXT816(0) << 0x40;
    auVar114 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar161),5);
    auVar165._16_16_ = auVar111;
    auVar165._0_16_ = auVar110;
    auVar129 = auVar165 & auVar114;
    if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar129 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar129 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar129 >> 0x7f,0) != '\0') ||
          (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar129 >> 0xbf,0) != '\0') ||
        (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar129[0x1f] < '\0') {
      local_28a0 = vandps_avx(auVar114,auVar165);
      local_2ce0._0_8_ = *(undefined8 *)ray;
      local_2ce0._8_8_ = *(undefined8 *)(ray + 8);
      local_2ce0._16_8_ = *(undefined8 *)(ray + 0x10);
      local_2ce0._24_8_ = *(undefined8 *)(ray + 0x18);
      local_2ce0._32_8_ = *(undefined8 *)(ray + 0x20);
      local_2ce0._40_8_ = *(undefined8 *)(ray + 0x28);
      local_2ce0._48_8_ = *(undefined8 *)(ray + 0x30);
      local_2ce0._56_8_ = *(undefined8 *)(ray + 0x38);
      local_2ce0._64_8_ = *(undefined8 *)(ray + 0x40);
      local_2ce0._72_8_ = *(undefined8 *)(ray + 0x48);
      local_2ce0._80_8_ = *(undefined8 *)(ray + 0x50);
      local_2ce0._88_8_ = *(undefined8 *)(ray + 0x58);
      local_2c80 = *(undefined1 (*) [32])(ray + 0x80);
      local_2c60 = *(undefined1 (*) [32])(ray + 0xa0);
      local_2c40 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar233._8_4_ = 0x7fffffff;
      auVar233._0_8_ = 0x7fffffff7fffffff;
      auVar233._12_4_ = 0x7fffffff;
      auVar233._16_4_ = 0x7fffffff;
      auVar233._20_4_ = 0x7fffffff;
      auVar233._24_4_ = 0x7fffffff;
      auVar233._28_4_ = 0x7fffffff;
      auVar114 = vandps_avx(auVar233,local_2c80);
      auVar257._8_4_ = 0x219392ef;
      auVar257._0_8_ = 0x219392ef219392ef;
      auVar257._12_4_ = 0x219392ef;
      auVar257._16_4_ = 0x219392ef;
      auVar257._20_4_ = 0x219392ef;
      auVar257._24_4_ = 0x219392ef;
      auVar257._28_4_ = 0x219392ef;
      auVar217._8_4_ = 0x3f800000;
      auVar217._0_8_ = 0x3f8000003f800000;
      auVar217._12_4_ = 0x3f800000;
      auVar217._16_4_ = 0x3f800000;
      auVar217._20_4_ = 0x3f800000;
      auVar217._24_4_ = 0x3f800000;
      auVar217._28_4_ = 0x3f800000;
      auVar129 = vcmpps_avx(auVar114,auVar257,1);
      auVar166 = vdivps_avx(auVar217,local_2c80);
      auVar114 = vandps_avx(auVar233,local_2c60);
      auVar176 = vdivps_avx(auVar217,local_2c60);
      auVar165 = vcmpps_avx(auVar114,auVar257,1);
      auVar194 = vdivps_avx(auVar217,local_2c40);
      auVar114 = vandps_avx(auVar233,local_2c40);
      auVar114 = vcmpps_avx(auVar114,auVar257,1);
      auVar234._8_4_ = 0x5d5e0b6b;
      auVar234._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar234._12_4_ = 0x5d5e0b6b;
      auVar234._16_4_ = 0x5d5e0b6b;
      auVar234._20_4_ = 0x5d5e0b6b;
      auVar234._24_4_ = 0x5d5e0b6b;
      auVar234._28_4_ = 0x5d5e0b6b;
      _local_2c20 = vblendvps_avx(auVar166,auVar234,auVar129);
      _local_2c00 = vblendvps_avx(auVar176,auVar234,auVar165);
      _local_2be0 = vblendvps_avx(auVar194,auVar234,auVar114);
      auVar114 = vcmpps_avx(_local_2c20,ZEXT1632(auVar161),1);
      auVar194._8_4_ = 0x10;
      auVar194._0_8_ = 0x1000000010;
      auVar194._12_4_ = 0x10;
      auVar194._16_4_ = 0x10;
      auVar194._20_4_ = 0x10;
      auVar194._24_4_ = 0x10;
      auVar194._28_4_ = 0x10;
      local_2bc0 = vandps_avx(auVar114,auVar194);
      auVar129 = ZEXT1632(auVar161);
      auVar114 = vcmpps_avx(_local_2c00,auVar129,5);
      auVar195._8_4_ = 0x20;
      auVar195._0_8_ = 0x2000000020;
      auVar195._12_4_ = 0x20;
      auVar195._16_4_ = 0x20;
      auVar195._20_4_ = 0x20;
      auVar195._24_4_ = 0x20;
      auVar195._28_4_ = 0x20;
      auVar206._8_4_ = 0x30;
      auVar206._0_8_ = 0x3000000030;
      auVar206._12_4_ = 0x30;
      auVar206._16_4_ = 0x30;
      auVar206._20_4_ = 0x30;
      auVar206._24_4_ = 0x30;
      auVar206._28_4_ = 0x30;
      local_2ba0 = vblendvps_avx(auVar206,auVar195,auVar114);
      auVar114 = vcmpps_avx(_local_2be0,auVar129,5);
      auVar176._8_4_ = 0x40;
      auVar176._0_8_ = 0x4000000040;
      auVar176._12_4_ = 0x40;
      auVar176._16_4_ = 0x40;
      auVar176._20_4_ = 0x40;
      auVar176._24_4_ = 0x40;
      auVar176._28_4_ = 0x40;
      auVar196._8_4_ = 0x50;
      auVar196._0_8_ = 0x5000000050;
      auVar196._12_4_ = 0x50;
      auVar196._16_4_ = 0x50;
      auVar196._20_4_ = 0x50;
      auVar196._24_4_ = 0x50;
      auVar196._28_4_ = 0x50;
      local_2b80 = vblendvps_avx(auVar196,auVar176,auVar114);
      auVar114 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar129);
      auVar166._8_4_ = 0x7f800000;
      auVar166._0_8_ = 0x7f8000007f800000;
      auVar166._12_4_ = 0x7f800000;
      auVar166._16_4_ = 0x7f800000;
      auVar166._20_4_ = 0x7f800000;
      auVar166._24_4_ = 0x7f800000;
      auVar166._28_4_ = 0x7f800000;
      local_2b60 = vblendvps_avx(auVar166,auVar114,local_28a0);
      auVar114 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar129);
      auVar129._8_4_ = 0xff800000;
      auVar129._0_8_ = 0xff800000ff800000;
      auVar129._12_4_ = 0xff800000;
      auVar129._16_4_ = 0xff800000;
      auVar129._20_4_ = 0xff800000;
      auVar129._24_4_ = 0xff800000;
      auVar129._28_4_ = 0xff800000;
      local_2b40 = vblendvps_avx(auVar129,auVar114,local_28a0);
      auVar114 = vcmpps_avx(local_2b40,local_2b40,0xf);
      local_2e80._4_4_ = local_28a0._4_4_ ^ auVar114._4_4_;
      local_2e80._0_4_ = local_28a0._0_4_ ^ auVar114._0_4_;
      local_2e80._8_4_ = local_28a0._8_4_ ^ auVar114._8_4_;
      local_2e80._12_4_ = local_28a0._12_4_ ^ auVar114._12_4_;
      local_2e80._16_4_ = local_28a0._16_4_ ^ auVar114._16_4_;
      uStack_2e6c = local_28a0._20_4_ ^ auVar114._20_4_;
      uStack_2e68 = local_28a0._24_4_ ^ auVar114._24_4_;
      uStack_2e64 = local_28a0._28_4_ ^ auVar114._28_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        local_2f30 = 5;
      }
      else {
        local_2f30 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                            RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      local_2f10 = ray + 0x100;
      local_2610 = 0xfffffffffffffff8;
      local_1e80 = 0x7f800000;
      uStack_1e7c = 0x7f800000;
      uStack_1e78 = 0x7f800000;
      uStack_1e74 = 0x7f800000;
      uStack_1e70 = 0x7f800000;
      uStack_1e6c = 0x7f800000;
      uStack_1e68 = 0x7f800000;
      uStack_1e64 = 0x7f800000;
      local_1e60 = local_2b60;
      local_2800._16_16_ = mm_lookupmask_ps._240_16_;
      local_2800._0_16_ = mm_lookupmask_ps._0_16_;
      auVar152 = ZEXT3264(local_2800);
      auVar114._8_4_ = 0xbf800000;
      auVar114._0_8_ = 0xbf800000bf800000;
      auVar114._12_4_ = 0xbf800000;
      auVar114._16_4_ = 0xbf800000;
      auVar114._20_4_ = 0xbf800000;
      auVar114._24_4_ = 0xbf800000;
      auVar114._28_4_ = 0xbf800000;
      auVar130._8_4_ = 0x3f800000;
      auVar130._0_8_ = 0x3f8000003f800000;
      auVar130._12_4_ = 0x3f800000;
      auVar130._16_4_ = 0x3f800000;
      auVar130._20_4_ = 0x3f800000;
      auVar130._24_4_ = 0x3f800000;
      auVar130._28_4_ = 0x3f800000;
      _local_2820 = vblendvps_avx(auVar130,auVar114,local_2800);
      pauVar104 = (undefined1 (*) [32])local_1e40;
      puVar107 = local_2600;
      local_2e40 = This;
      local_2e20 = ray;
      local_2e18 = context;
LAB_00f51dd0:
      do {
        do {
          local_2f38.ptr = puVar107[-1];
          if (local_2f38.ptr == 0xfffffffffffffff8) goto LAB_00f53523;
          local_2f28 = puVar107 + -1;
          local_2f40 = pauVar104 + -1;
          auVar114 = *local_2f40;
          auVar129 = vcmpps_avx(auVar114,local_2b40,1);
          pauVar104 = local_2f40;
          puVar107 = local_2f28;
        } while ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar129 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar129 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar129 >> 0x7f,0) == '\0') &&
                   (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar129 >> 0xbf,0) == '\0') &&
                 (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 -1 < auVar129[0x1f]);
        uVar101 = vmovmskps_avx(auVar129);
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar101);
        if (local_2f30 < (uint)POPCOUNT(uVar101)) {
LAB_00f51e1b:
          auVar136 = ZEXT3264(auVar114);
          pauVar104 = local_2f40;
          do {
            uVar96 = (uint)local_2f38.ptr;
            if ((local_2f38.ptr & 8) != 0) {
              if (local_2f38.ptr == 0xfffffffffffffff8) goto LAB_00f53523;
              auVar114 = vcmpps_avx(local_2b40,auVar136._0_32_,6);
              if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar114 >> 0x7f,0) != '\0') ||
                    (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar114 >> 0xbf,0) != '\0') ||
                  (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar114[0x1f] < '\0') {
                local_2e38 = (ulong)(uVar96 & 0xf) - 8;
                NVar105.ptr = local_2f38.ptr & 0xfffffffffffffff0;
                auVar114 = vcmpps_avx(auVar114,auVar114,0xf);
                auVar136 = ZEXT3264(auVar114);
                lVar98 = 0;
                uVar96 = auVar114._0_4_ ^ local_2e80._0_4_;
                uVar76 = auVar114._4_4_ ^ local_2e80._4_4_;
                uVar77 = auVar114._8_4_ ^ local_2e80._8_4_;
                uVar78 = auVar114._12_4_ ^ local_2e80._12_4_;
                uVar79 = auVar114._16_4_ ^ local_2e80._16_4_;
                uVar80 = auVar114._20_4_ ^ uStack_2e6c;
                uVar81 = auVar114._24_4_ ^ uStack_2e68;
                uVar82 = auVar114._28_4_ ^ uStack_2e64;
                local_2f40 = pauVar104;
                local_2f38.ptr = NVar105.ptr;
                local_2f28 = puVar107;
                while (lVar98 != local_2e38) {
                  local_2d60._4_4_ = uVar76;
                  local_2d60._0_4_ = uVar96;
                  local_2d60._8_4_ = uVar77;
                  local_2d60._12_4_ = uVar78;
                  local_2d60._16_4_ = uVar79;
                  local_2d60._20_4_ = uVar80;
                  local_2d60._24_4_ = uVar81;
                  local_2d60._28_4_ = uVar82;
                  lVar94 = lVar98 * 0x90;
                  auVar111._8_8_ = 0;
                  auVar111._0_8_ = *(ulong *)(NVar105.ptr + 0x20 + lVar94);
                  auVar110._8_8_ = 0;
                  auVar110._0_8_ = *(ulong *)(NVar105.ptr + 0x24 + lVar94);
                  auVar110 = vpminub_avx(auVar111,auVar110);
                  auVar111 = vpcmpeqb_avx(auVar111,auVar110);
                  auVar110 = vpcmpeqd_avx(auVar110,auVar110);
                  auVar111 = vpmovzxbd_avx(auVar111 ^ auVar110);
                  auVar111 = vpslld_avx(auVar111 ^ auVar110,0x1f);
                  auVar136 = ZEXT1664(auVar111);
                  uVar96 = vmovmskps_avx(auVar111);
                  local_2e30 = lVar98;
                  if (uVar96 != 0) {
                    lVar98 = NVar105.ptr + lVar94;
                    uVar101 = *(undefined4 *)(NVar105.ptr + 0x80 + lVar94);
                    auVar119._4_4_ = uVar101;
                    auVar119._0_4_ = uVar101;
                    auVar119._8_4_ = uVar101;
                    auVar119._12_4_ = uVar101;
                    auVar119._16_4_ = uVar101;
                    auVar119._20_4_ = uVar101;
                    auVar119._24_4_ = uVar101;
                    auVar119._28_4_ = uVar101;
                    auVar114 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar119);
                    fVar211 = *(float *)(NVar105.ptr + 0x84 + lVar94);
                    local_2840 = fVar211 * auVar114._0_4_;
                    fStack_283c = fVar211 * auVar114._4_4_;
                    fStack_2838 = fVar211 * auVar114._8_4_;
                    fStack_2834 = fVar211 * auVar114._12_4_;
                    fStack_2830 = fVar211 * auVar114._16_4_;
                    fStack_282c = fVar211 * auVar114._20_4_;
                    fStack_2828 = fVar211 * auVar114._24_4_;
                    uStack_2824 = auVar114._28_4_;
                    uVar93 = (ulong)(uVar96 & 0xff);
                    local_2f08 = lVar98;
                    do {
                      lVar94 = 0;
                      if (uVar93 != 0) {
                        for (; (uVar93 >> lVar94 & 1) == 0; lVar94 = lVar94 + 1) {
                        }
                      }
                      auVar161._8_8_ = 0;
                      auVar161._0_8_ = *(ulong *)(lVar98 + 0x20);
                      auVar111 = vpmovzxbd_avx(auVar161);
                      auVar111 = vcvtdq2ps_avx(auVar111);
                      fVar211 = *(float *)(lVar98 + 0x44);
                      fVar154 = *(float *)(lVar98 + 0x38);
                      local_2b20[0] = fVar154 + fVar211 * auVar111._0_4_;
                      local_2b20[1] = fVar154 + fVar211 * auVar111._4_4_;
                      local_2b20[2] = fVar154 + fVar211 * auVar111._8_4_;
                      local_2b20[3] = fVar154 + fVar211 * auVar111._12_4_;
                      fVar155 = local_2b20[lVar94];
                      auVar162._8_8_ = 0;
                      auVar162._0_8_ = *(ulong *)(lVar98 + 0x50);
                      auVar111 = vpmovzxbd_avx(auVar162);
                      auVar111 = vcvtdq2ps_avx(auVar111);
                      fVar156 = *(float *)(lVar98 + 0x74);
                      fVar157 = *(float *)(lVar98 + 0x68);
                      local_29c0[0] = fVar157 + fVar156 * auVar111._0_4_;
                      local_29c0[1] = fVar157 + fVar156 * auVar111._4_4_;
                      local_29c0[2] = fVar157 + fVar156 * auVar111._8_4_;
                      local_29c0[3] = fVar157 + fVar156 * auVar111._12_4_;
                      auVar111 = vshufps_avx(ZEXT416((uint)(local_29c0[lVar94] - fVar155)),
                                             ZEXT416((uint)(local_29c0[lVar94] - fVar155)),0);
                      auVar120._0_4_ = fVar155 + local_2840 * auVar111._0_4_;
                      auVar120._4_4_ = fVar155 + fStack_283c * auVar111._4_4_;
                      auVar120._8_4_ = fVar155 + fStack_2838 * auVar111._8_4_;
                      auVar120._12_4_ = fVar155 + fStack_2834 * auVar111._12_4_;
                      auVar120._16_4_ = fVar155 + fStack_2830 * auVar111._0_4_;
                      auVar120._20_4_ = fVar155 + fStack_282c * auVar111._4_4_;
                      auVar120._24_4_ = fVar155 + fStack_2828 * auVar111._8_4_;
                      auVar120._28_4_ = fVar155 + auVar111._12_4_;
                      auVar163._8_8_ = 0;
                      auVar163._0_8_ = *(ulong *)(lVar98 + 0x24);
                      auVar111 = vpmovzxbd_avx(auVar163);
                      auVar111 = vcvtdq2ps_avx(auVar111);
                      local_2b20[0] = fVar154 + fVar211 * auVar111._0_4_;
                      local_2b20[1] = fVar154 + fVar211 * auVar111._4_4_;
                      local_2b20[2] = fVar154 + fVar211 * auVar111._8_4_;
                      local_2b20[3] = fVar154 + fVar211 * auVar111._12_4_;
                      fVar211 = local_2b20[lVar94];
                      auVar141._8_8_ = 0;
                      auVar141._0_8_ = *(ulong *)(lVar98 + 0x54);
                      auVar111 = vpmovzxbd_avx(auVar141);
                      auVar111 = vcvtdq2ps_avx(auVar111);
                      local_29c0[0] = fVar157 + fVar156 * auVar111._0_4_;
                      local_29c0[1] = fVar157 + fVar156 * auVar111._4_4_;
                      local_29c0[2] = fVar157 + fVar156 * auVar111._8_4_;
                      local_29c0[3] = fVar157 + fVar156 * auVar111._12_4_;
                      auVar111 = vshufps_avx(ZEXT416((uint)(local_29c0[lVar94] - fVar211)),
                                             ZEXT416((uint)(local_29c0[lVar94] - fVar211)),0);
                      auVar132._0_4_ = fVar211 + local_2840 * auVar111._0_4_;
                      auVar132._4_4_ = fVar211 + fStack_283c * auVar111._4_4_;
                      auVar132._8_4_ = fVar211 + fStack_2838 * auVar111._8_4_;
                      auVar132._12_4_ = fVar211 + fStack_2834 * auVar111._12_4_;
                      auVar132._16_4_ = fVar211 + fStack_2830 * auVar111._0_4_;
                      auVar132._20_4_ = fVar211 + fStack_282c * auVar111._4_4_;
                      auVar132._24_4_ = fVar211 + fStack_2828 * auVar111._8_4_;
                      auVar132._28_4_ = fVar211 + auVar111._12_4_;
                      auVar142._8_8_ = 0;
                      auVar142._0_8_ = *(ulong *)(lVar98 + 0x28);
                      auVar111 = vpmovzxbd_avx(auVar142);
                      auVar111 = vcvtdq2ps_avx(auVar111);
                      fVar211 = *(float *)(lVar98 + 0x48);
                      fVar154 = *(float *)(lVar98 + 0x3c);
                      local_2b20[0] = fVar154 + fVar211 * auVar111._0_4_;
                      local_2b20[1] = fVar154 + fVar211 * auVar111._4_4_;
                      local_2b20[2] = fVar154 + fVar211 * auVar111._8_4_;
                      local_2b20[3] = fVar154 + fVar211 * auVar111._12_4_;
                      fVar155 = local_2b20[lVar94];
                      auVar190._8_8_ = 0;
                      auVar190._0_8_ = *(ulong *)(lVar98 + 0x58);
                      auVar111 = vpmovzxbd_avx(auVar190);
                      auVar111 = vcvtdq2ps_avx(auVar111);
                      fVar156 = *(float *)(lVar98 + 0x78);
                      fVar157 = *(float *)(lVar98 + 0x6c);
                      local_29c0[0] = fVar157 + fVar156 * auVar111._0_4_;
                      local_29c0[1] = fVar157 + fVar156 * auVar111._4_4_;
                      local_29c0[2] = fVar157 + fVar156 * auVar111._8_4_;
                      local_29c0[3] = fVar157 + fVar156 * auVar111._12_4_;
                      auVar111 = vshufps_avx(ZEXT416((uint)(local_29c0[lVar94] - fVar155)),
                                             ZEXT416((uint)(local_29c0[lVar94] - fVar155)),0);
                      auVar145._0_4_ = fVar155 + local_2840 * auVar111._0_4_;
                      auVar145._4_4_ = fVar155 + fStack_283c * auVar111._4_4_;
                      auVar145._8_4_ = fVar155 + fStack_2838 * auVar111._8_4_;
                      auVar145._12_4_ = fVar155 + fStack_2834 * auVar111._12_4_;
                      auVar145._16_4_ = fVar155 + fStack_2830 * auVar111._0_4_;
                      auVar145._20_4_ = fVar155 + fStack_282c * auVar111._4_4_;
                      auVar145._24_4_ = fVar155 + fStack_2828 * auVar111._8_4_;
                      auVar145._28_4_ = fVar155 + auVar111._12_4_;
                      auVar191._8_8_ = 0;
                      auVar191._0_8_ = *(ulong *)(lVar98 + 0x2c);
                      auVar111 = vpmovzxbd_avx(auVar191);
                      auVar111 = vcvtdq2ps_avx(auVar111);
                      local_2b20[0] = fVar154 + fVar211 * auVar111._0_4_;
                      local_2b20[1] = fVar154 + fVar211 * auVar111._4_4_;
                      local_2b20[2] = fVar154 + fVar211 * auVar111._8_4_;
                      local_2b20[3] = fVar154 + fVar211 * auVar111._12_4_;
                      fVar211 = local_2b20[lVar94];
                      auVar173._8_8_ = 0;
                      auVar173._0_8_ = *(ulong *)(lVar98 + 0x5c);
                      auVar111 = vpmovzxbd_avx(auVar173);
                      auVar111 = vcvtdq2ps_avx(auVar111);
                      local_29c0[0] = fVar157 + fVar156 * auVar111._0_4_;
                      local_29c0[1] = fVar157 + fVar156 * auVar111._4_4_;
                      local_29c0[2] = fVar157 + fVar156 * auVar111._8_4_;
                      local_29c0[3] = fVar157 + fVar156 * auVar111._12_4_;
                      auVar111 = vshufps_avx(ZEXT416((uint)(local_29c0[lVar94] - fVar211)),
                                             ZEXT416((uint)(local_29c0[lVar94] - fVar211)),0);
                      auVar169._0_4_ = fVar211 + local_2840 * auVar111._0_4_;
                      auVar169._4_4_ = fVar211 + fStack_283c * auVar111._4_4_;
                      auVar169._8_4_ = fVar211 + fStack_2838 * auVar111._8_4_;
                      auVar169._12_4_ = fVar211 + fStack_2834 * auVar111._12_4_;
                      auVar169._16_4_ = fVar211 + fStack_2830 * auVar111._0_4_;
                      auVar169._20_4_ = fVar211 + fStack_282c * auVar111._4_4_;
                      auVar169._24_4_ = fVar211 + fStack_2828 * auVar111._8_4_;
                      auVar169._28_4_ = fVar211 + auVar111._12_4_;
                      auVar174._8_8_ = 0;
                      auVar174._0_8_ = *(ulong *)(lVar98 + 0x30);
                      auVar111 = vpmovzxbd_avx(auVar174);
                      auVar111 = vcvtdq2ps_avx(auVar111);
                      fVar211 = *(float *)(lVar98 + 0x4c);
                      fVar154 = *(float *)(lVar98 + 0x40);
                      local_2b20[0] = fVar154 + fVar211 * auVar111._0_4_;
                      local_2b20[1] = fVar154 + fVar211 * auVar111._4_4_;
                      local_2b20[2] = fVar154 + fVar211 * auVar111._8_4_;
                      local_2b20[3] = fVar154 + fVar211 * auVar111._12_4_;
                      fVar155 = local_2b20[lVar94];
                      auVar214._8_8_ = 0;
                      auVar214._0_8_ = *(ulong *)(lVar98 + 0x60);
                      auVar111 = vpmovzxbd_avx(auVar214);
                      auVar111 = vcvtdq2ps_avx(auVar111);
                      fVar156 = *(float *)(lVar98 + 0x7c);
                      fVar157 = *(float *)(lVar98 + 0x70);
                      local_29c0[0] = fVar157 + fVar156 * auVar111._0_4_;
                      local_29c0[1] = fVar157 + fVar156 * auVar111._4_4_;
                      local_29c0[2] = fVar157 + fVar156 * auVar111._8_4_;
                      local_29c0[3] = fVar157 + fVar156 * auVar111._12_4_;
                      auVar111 = vshufps_avx(ZEXT416((uint)(local_29c0[lVar94] - fVar155)),
                                             ZEXT416((uint)(local_29c0[lVar94] - fVar155)),0);
                      auVar179._0_4_ = fVar155 + local_2840 * auVar111._0_4_;
                      auVar179._4_4_ = fVar155 + fStack_283c * auVar111._4_4_;
                      auVar179._8_4_ = fVar155 + fStack_2838 * auVar111._8_4_;
                      auVar179._12_4_ = fVar155 + fStack_2834 * auVar111._12_4_;
                      auVar179._16_4_ = fVar155 + fStack_2830 * auVar111._0_4_;
                      auVar179._20_4_ = fVar155 + fStack_282c * auVar111._4_4_;
                      auVar179._24_4_ = fVar155 + fStack_2828 * auVar111._8_4_;
                      auVar179._28_4_ = fVar155 + auVar111._12_4_;
                      auVar215._8_8_ = 0;
                      auVar215._0_8_ = *(ulong *)(lVar98 + 0x34);
                      auVar111 = vpmovzxbd_avx(auVar215);
                      auVar111 = vcvtdq2ps_avx(auVar111);
                      local_2b20[0] = fVar154 + fVar211 * auVar111._0_4_;
                      local_2b20[1] = fVar154 + fVar211 * auVar111._4_4_;
                      local_2b20[2] = fVar154 + fVar211 * auVar111._8_4_;
                      local_2b20[3] = fVar154 + fVar211 * auVar111._12_4_;
                      fVar211 = local_2b20[lVar94];
                      auVar204._8_8_ = 0;
                      auVar204._0_8_ = *(ulong *)(lVar98 + 100);
                      auVar111 = vpmovzxbd_avx(auVar204);
                      auVar111 = vcvtdq2ps_avx(auVar111);
                      local_29c0[0] = fVar157 + fVar156 * auVar111._0_4_;
                      local_29c0[1] = fVar157 + fVar156 * auVar111._4_4_;
                      local_29c0[2] = fVar157 + fVar156 * auVar111._8_4_;
                      local_29c0[3] = fVar157 + fVar156 * auVar111._12_4_;
                      auVar111 = vshufps_avx(ZEXT416((uint)(local_29c0[lVar94] - fVar211)),
                                             ZEXT416((uint)(local_29c0[lVar94] - fVar211)),0);
                      auVar198._0_4_ = fVar211 + local_2840 * auVar111._0_4_;
                      auVar198._4_4_ = fVar211 + fStack_283c * auVar111._4_4_;
                      auVar198._8_4_ = fVar211 + fStack_2838 * auVar111._8_4_;
                      auVar198._12_4_ = fVar211 + fStack_2834 * auVar111._12_4_;
                      auVar198._16_4_ = fVar211 + fStack_2830 * auVar111._0_4_;
                      auVar198._20_4_ = fVar211 + fStack_282c * auVar111._4_4_;
                      auVar198._24_4_ = fVar211 + fStack_2828 * auVar111._8_4_;
                      auVar198._28_4_ = fVar211 + auVar111._12_4_;
                      auVar84._8_8_ = local_2ce0._8_8_;
                      auVar84._0_8_ = local_2ce0._0_8_;
                      auVar84._16_8_ = local_2ce0._16_8_;
                      auVar84._24_8_ = local_2ce0._24_8_;
                      auVar86._8_8_ = local_2ce0._40_8_;
                      auVar86._0_8_ = local_2ce0._32_8_;
                      auVar86._16_8_ = local_2ce0._48_8_;
                      auVar86._24_8_ = local_2ce0._56_8_;
                      auVar88._8_8_ = local_2ce0._72_8_;
                      auVar88._0_8_ = local_2ce0._64_8_;
                      auVar88._16_8_ = local_2ce0._80_8_;
                      auVar88._24_8_ = local_2ce0._88_8_;
                      auVar114 = vsubps_avx(auVar120,auVar84);
                      auVar31._4_4_ = local_2c20._4_4_ * auVar114._4_4_;
                      auVar31._0_4_ = local_2c20._0_4_ * auVar114._0_4_;
                      auVar31._8_4_ = local_2c20._8_4_ * auVar114._8_4_;
                      auVar31._12_4_ = local_2c20._12_4_ * auVar114._12_4_;
                      auVar31._16_4_ = local_2c20._16_4_ * auVar114._16_4_;
                      auVar31._20_4_ = local_2c20._20_4_ * auVar114._20_4_;
                      auVar31._24_4_ = local_2c20._24_4_ * auVar114._24_4_;
                      auVar31._28_4_ = auVar114._28_4_;
                      auVar114 = vsubps_avx(auVar145,auVar86);
                      auVar32._4_4_ = (float)local_2c00._4_4_ * auVar114._4_4_;
                      auVar32._0_4_ = (float)local_2c00._0_4_ * auVar114._0_4_;
                      auVar32._8_4_ = fStack_2bf8 * auVar114._8_4_;
                      auVar32._12_4_ = fStack_2bf4 * auVar114._12_4_;
                      auVar32._16_4_ = fStack_2bf0 * auVar114._16_4_;
                      auVar32._20_4_ = fStack_2bec * auVar114._20_4_;
                      auVar32._24_4_ = fStack_2be8 * auVar114._24_4_;
                      auVar32._28_4_ = auVar114._28_4_;
                      auVar152 = ZEXT3264(auVar32);
                      auVar114 = vsubps_avx(auVar179,auVar88);
                      auVar33._4_4_ = (float)local_2be0._4_4_ * auVar114._4_4_;
                      auVar33._0_4_ = (float)local_2be0._0_4_ * auVar114._0_4_;
                      auVar33._8_4_ = fStack_2bd8 * auVar114._8_4_;
                      auVar33._12_4_ = fStack_2bd4 * auVar114._12_4_;
                      auVar33._16_4_ = fStack_2bd0 * auVar114._16_4_;
                      auVar33._20_4_ = fStack_2bcc * auVar114._20_4_;
                      auVar33._24_4_ = fStack_2bc8 * auVar114._24_4_;
                      auVar33._28_4_ = auVar114._28_4_;
                      auVar114 = vsubps_avx(auVar132,auVar84);
                      auVar34._4_4_ = local_2c20._4_4_ * auVar114._4_4_;
                      auVar34._0_4_ = local_2c20._0_4_ * auVar114._0_4_;
                      auVar34._8_4_ = local_2c20._8_4_ * auVar114._8_4_;
                      auVar34._12_4_ = local_2c20._12_4_ * auVar114._12_4_;
                      auVar34._16_4_ = local_2c20._16_4_ * auVar114._16_4_;
                      auVar34._20_4_ = local_2c20._20_4_ * auVar114._20_4_;
                      auVar34._24_4_ = local_2c20._24_4_ * auVar114._24_4_;
                      auVar34._28_4_ = auVar114._28_4_;
                      auVar114 = vsubps_avx(auVar169,auVar86);
                      auVar35._4_4_ = (float)local_2c00._4_4_ * auVar114._4_4_;
                      auVar35._0_4_ = (float)local_2c00._0_4_ * auVar114._0_4_;
                      auVar35._8_4_ = fStack_2bf8 * auVar114._8_4_;
                      auVar35._12_4_ = fStack_2bf4 * auVar114._12_4_;
                      auVar35._16_4_ = fStack_2bf0 * auVar114._16_4_;
                      auVar35._20_4_ = fStack_2bec * auVar114._20_4_;
                      auVar35._24_4_ = fStack_2be8 * auVar114._24_4_;
                      auVar35._28_4_ = auVar114._28_4_;
                      auVar114 = vsubps_avx(auVar198,auVar88);
                      auVar36._4_4_ = (float)local_2be0._4_4_ * auVar114._4_4_;
                      auVar36._0_4_ = (float)local_2be0._0_4_ * auVar114._0_4_;
                      auVar36._8_4_ = fStack_2bd8 * auVar114._8_4_;
                      auVar36._12_4_ = fStack_2bd4 * auVar114._12_4_;
                      auVar36._16_4_ = fStack_2bd0 * auVar114._16_4_;
                      auVar36._20_4_ = fStack_2bcc * auVar114._20_4_;
                      auVar36._24_4_ = fStack_2bc8 * auVar114._24_4_;
                      auVar36._28_4_ = auVar114._28_4_;
                      auVar114 = vminps_avx(auVar31,auVar34);
                      auVar129 = vminps_avx(auVar32,auVar35);
                      auVar114 = vmaxps_avx(auVar114,auVar129);
                      auVar129 = vminps_avx(auVar33,auVar36);
                      auVar114 = vmaxps_avx(auVar114,auVar129);
                      auVar37._4_4_ = auVar114._4_4_ * 0.99999964;
                      auVar37._0_4_ = auVar114._0_4_ * 0.99999964;
                      auVar37._8_4_ = auVar114._8_4_ * 0.99999964;
                      auVar37._12_4_ = auVar114._12_4_ * 0.99999964;
                      auVar37._16_4_ = auVar114._16_4_ * 0.99999964;
                      auVar37._20_4_ = auVar114._20_4_ * 0.99999964;
                      auVar37._24_4_ = auVar114._24_4_ * 0.99999964;
                      auVar37._28_4_ = auVar114._28_4_;
                      auVar114 = vmaxps_avx(auVar31,auVar34);
                      auVar129 = vmaxps_avx(auVar32,auVar35);
                      auVar129 = vminps_avx(auVar114,auVar129);
                      auVar114 = vmaxps_avx(auVar33,auVar36);
                      auVar114 = vminps_avx(auVar129,auVar114);
                      auVar38._4_4_ = auVar114._4_4_ * 1.0000004;
                      auVar38._0_4_ = auVar114._0_4_ * 1.0000004;
                      auVar38._8_4_ = auVar114._8_4_ * 1.0000004;
                      auVar38._12_4_ = auVar114._12_4_ * 1.0000004;
                      auVar38._16_4_ = auVar114._16_4_ * 1.0000004;
                      auVar38._20_4_ = auVar114._20_4_ * 1.0000004;
                      auVar38._24_4_ = auVar114._24_4_ * 1.0000004;
                      auVar38._28_4_ = auVar114._28_4_;
                      auVar114 = vmaxps_avx(auVar37,local_2b60);
                      auVar129 = vminps_avx(auVar38,local_2b40);
                      auVar114 = vcmpps_avx(auVar114,auVar129,2);
                      auVar129 = local_2d60 & auVar114;
                      local_2e28 = uVar93;
                      if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar129 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar129 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar129 >> 0x7f,0) == '\0') &&
                            (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar129 >> 0xbf,0) == '\0') &&
                          (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar129[0x1f]) {
                        bVar108 = false;
                      }
                      else {
                        uVar1 = *(ushort *)(lVar98 + lVar94 * 8);
                        local_2e00 = (ulong)*(uint *)(lVar98 + 0x88);
                        uVar96 = *(uint *)(lVar98 + 4 + lVar94 * 8);
                        local_2e08 = (ulong)uVar96;
                        local_2d00 = local_2d60;
                        uVar101 = vmovmskps_avx(local_2d60);
                        local_2f18 = uVar1 & 0x7fff;
                        local_2f14 = (uint)*(ushort *)(lVar98 + 2 + lVar94 * 8);
                        local_2f1c = local_2f14 & 0x7fff;
                        local_2e10 = (ulong)(-1 < (short)uVar1);
                        auVar111 = vpshufd_avx(ZEXT416(local_2f18),0);
                        auVar111 = vpaddd_avx(auVar111,_DAT_01f76ad0);
                        auVar110 = vpshufd_avx(ZEXT416(local_2f1c),0);
                        auVar110 = vpaddd_avx(auVar110,_DAT_01f76ae0);
                        auVar121._16_16_ = auVar111;
                        auVar121._0_16_ = auVar111;
                        _local_27a0 = vcvtdq2ps_avx(auVar121);
                        auVar122._16_16_ = auVar110;
                        auVar122._0_16_ = auVar110;
                        _local_27c0 = vcvtdq2ps_avx(auVar122);
                        auVar111 = vpshufd_avx(ZEXT416(*(uint *)(lVar98 + 0x88)),0);
                        local_2860._16_16_ = auVar111;
                        local_2860._0_16_ = auVar111;
                        auVar111 = vpshufd_avx(ZEXT416(uVar96),0);
                        local_2880._16_16_ = auVar111;
                        local_2880._0_16_ = auVar111;
                        unaff_RBX = local_2e00;
                        uVar93 = CONCAT44((int)((ulong)in_R11 >> 0x20),uVar101);
                        while (uVar102 = local_2e00, pRVar91 = local_2e18, pRVar90 = local_2e20,
                              puVar89 = local_2f28, uVar93 != 0) {
                          lVar98 = 0;
                          if (uVar93 != 0) {
                            for (; (uVar93 >> lVar98 & 1) == 0; lVar98 = lVar98 + 1) {
                            }
                          }
                          local_2ec0._0_8_ = lVar98;
                          local_2d20._0_8_ = uVar93 - 1 & uVar93;
                          local_2de8 = context->scene;
                          pGVar2 = (local_2de8->geometries).items[unaff_RBX].ptr;
                          local_2df0 = *(long *)&pGVar2->field_0x58;
                          auVar112._8_8_ = 0;
                          auVar112._0_4_ = (pGVar2->time_range).lower;
                          auVar112._4_4_ = (pGVar2->time_range).upper;
                          auVar111 = vshufps_avx(auVar112,auVar112,0);
                          auVar146._16_16_ = auVar111;
                          auVar146._0_16_ = auVar111;
                          fVar211 = pGVar2->fnumTimeSegments;
                          auVar114 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar146);
                          auVar110 = vshufps_avx(auVar112,auVar112,0x55);
                          auVar111 = vsubps_avx(auVar110,auVar111);
                          auVar123._16_16_ = auVar111;
                          auVar123._0_16_ = auVar111;
                          auVar114 = vdivps_avx(auVar114,auVar123);
                          local_2df8 = pGVar2[1].super_RefCount.refCounter.
                                       super___atomic_base<unsigned_long>._M_i * local_2e08;
                          auVar39._4_4_ = fVar211 * auVar114._4_4_;
                          auVar39._0_4_ = fVar211 * auVar114._0_4_;
                          auVar39._8_4_ = fVar211 * auVar114._8_4_;
                          auVar39._12_4_ = fVar211 * auVar114._12_4_;
                          auVar39._16_4_ = fVar211 * auVar114._16_4_;
                          auVar39._20_4_ = fVar211 * auVar114._20_4_;
                          auVar39._24_4_ = fVar211 * auVar114._24_4_;
                          auVar39._28_4_ = auVar114._28_4_;
                          auVar114 = vroundps_avx(auVar39,1);
                          auVar111 = vshufps_avx(ZEXT416((uint)(fVar211 + -1.0)),
                                                 ZEXT416((uint)(fVar211 + -1.0)),0);
                          auVar147._16_16_ = auVar111;
                          auVar147._0_16_ = auVar111;
                          auVar114 = vminps_avx(auVar114,auVar147);
                          auVar114 = vmaxps_avx(auVar114,_DAT_01f7b000);
                          local_2640 = vsubps_avx(auVar39,auVar114);
                          local_2660 = vcvtps2dq_avx(auVar114);
                          uVar96 = *(uint *)(local_2df0 + 4 + local_2df8);
                          uVar103 = (ulong)uVar96;
                          uVar106 = (ulong)(uVar96 * local_2f1c +
                                           *(int *)(local_2df0 + local_2df8) + local_2f18);
                          lVar3 = *(long *)&pGVar2[2].numPrimitives;
                          lVar99 = (long)*(int *)(local_2660 + lVar98 * 4) * 0x38;
                          lVar4 = *(long *)(lVar3 + lVar99);
                          lVar5 = *(long *)(lVar3 + 0x10 + lVar99);
                          auVar111 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar106);
                          lVar6 = *(long *)(lVar3 + 0x48 + lVar99);
                          auVar110 = *(undefined1 (*) [16])(lVar4 + (uVar106 + 1) * lVar5);
                          lVar94 = uVar106 + uVar103;
                          auVar139 = *(undefined1 (*) [16])(lVar4 + lVar94 * lVar5);
                          lVar100 = uVar106 + uVar103 + 1;
                          auVar161 = *(undefined1 (*) [16])(lVar4 + lVar100 * lVar5);
                          lVar95 = uVar106 + local_2e10 + 1;
                          auVar109 = *(undefined1 (*) [16])(lVar4 + lVar95 * lVar5);
                          lVar97 = local_2e10 + lVar100;
                          uVar93 = 0;
                          if (-1 < (short)local_2f14) {
                            uVar93 = uVar103;
                          }
                          auVar140 = *(undefined1 (*) [16])(lVar4 + lVar97 * lVar5);
                          auVar160 = *(undefined1 (*) [16])(lVar4 + (lVar94 + uVar93) * lVar5);
                          auVar172 = *(undefined1 (*) [16])(lVar4 + (lVar100 + uVar93) * lVar5);
                          auVar189 = *(undefined1 (*) [16])(lVar4 + lVar5 * (uVar93 + lVar97));
                          lVar3 = *(long *)(lVar3 + 0x38 + lVar99);
                          fVar211 = *(float *)(local_2640 + lVar98 * 4);
                          auVar203 = vsubps_avx(*(undefined1 (*) [16])(lVar3 + lVar6 * uVar106),
                                                auVar111);
                          auVar143._0_4_ = fVar211 * auVar203._0_4_ + auVar111._0_4_;
                          auVar143._4_4_ = fVar211 * auVar203._4_4_ + auVar111._4_4_;
                          auVar143._8_4_ = fVar211 * auVar203._8_4_ + auVar111._8_4_;
                          auVar143._12_4_ = fVar211 * auVar203._12_4_ + auVar111._12_4_;
                          auVar111 = vsubps_avx(*(undefined1 (*) [16])
                                                 (lVar3 + lVar6 * (uVar106 + 1)),auVar110);
                          auVar246._0_4_ = fVar211 * auVar111._0_4_ + auVar110._0_4_;
                          auVar246._4_4_ = fVar211 * auVar111._4_4_ + auVar110._4_4_;
                          auVar246._8_4_ = fVar211 * auVar111._8_4_ + auVar110._8_4_;
                          auVar246._12_4_ = fVar211 * auVar111._12_4_ + auVar110._12_4_;
                          auVar111 = vsubps_avx(*(undefined1 (*) [16])(lVar3 + lVar6 * lVar94),
                                                auVar139);
                          auVar113._0_4_ = fVar211 * auVar111._0_4_ + auVar139._0_4_;
                          auVar113._4_4_ = fVar211 * auVar111._4_4_ + auVar139._4_4_;
                          auVar113._8_4_ = fVar211 * auVar111._8_4_ + auVar139._8_4_;
                          auVar113._12_4_ = fVar211 * auVar111._12_4_ + auVar139._12_4_;
                          auVar111 = vsubps_avx(*(undefined1 (*) [16])(lVar3 + lVar6 * lVar100),
                                                auVar161);
                          auVar127._0_4_ = fVar211 * auVar111._0_4_ + auVar161._0_4_;
                          auVar127._4_4_ = fVar211 * auVar111._4_4_ + auVar161._4_4_;
                          auVar127._8_4_ = fVar211 * auVar111._8_4_ + auVar161._8_4_;
                          auVar127._12_4_ = fVar211 * auVar111._12_4_ + auVar161._12_4_;
                          auVar111 = vsubps_avx(*(undefined1 (*) [16])(lVar3 + lVar6 * lVar95),
                                                auVar109);
                          auVar175._0_4_ = fVar211 * auVar111._0_4_ + auVar109._0_4_;
                          auVar175._4_4_ = fVar211 * auVar111._4_4_ + auVar109._4_4_;
                          auVar175._8_4_ = fVar211 * auVar111._8_4_ + auVar109._8_4_;
                          auVar175._12_4_ = fVar211 * auVar111._12_4_ + auVar109._12_4_;
                          auVar111 = vsubps_avx(*(undefined1 (*) [16])(lVar3 + lVar6 * lVar97),
                                                auVar140);
                          auVar192._0_4_ = fVar211 * auVar111._0_4_ + auVar140._0_4_;
                          auVar192._4_4_ = fVar211 * auVar111._4_4_ + auVar140._4_4_;
                          auVar192._8_4_ = fVar211 * auVar111._8_4_ + auVar140._8_4_;
                          auVar192._12_4_ = fVar211 * auVar111._12_4_ + auVar140._12_4_;
                          auVar111 = vsubps_avx(*(undefined1 (*) [16])
                                                 (lVar3 + lVar6 * (lVar94 + uVar93)),auVar160);
                          auVar164._0_4_ = auVar160._0_4_ + fVar211 * auVar111._0_4_;
                          auVar164._4_4_ = auVar160._4_4_ + fVar211 * auVar111._4_4_;
                          auVar164._8_4_ = auVar160._8_4_ + fVar211 * auVar111._8_4_;
                          auVar164._12_4_ = auVar160._12_4_ + fVar211 * auVar111._12_4_;
                          auVar111 = vsubps_avx(*(undefined1 (*) [16])
                                                 (lVar3 + lVar6 * (lVar100 + uVar93)),auVar172);
                          auVar205._0_4_ = auVar172._0_4_ + fVar211 * auVar111._0_4_;
                          auVar205._4_4_ = auVar172._4_4_ + fVar211 * auVar111._4_4_;
                          auVar205._8_4_ = auVar172._8_4_ + fVar211 * auVar111._8_4_;
                          auVar205._12_4_ = auVar172._12_4_ + fVar211 * auVar111._12_4_;
                          auVar111 = vsubps_avx(*(undefined1 (*) [16])
                                                 (lVar3 + (uVar93 + lVar97) * lVar6),auVar189);
                          auVar216._0_4_ = auVar189._0_4_ + fVar211 * auVar111._0_4_;
                          auVar216._4_4_ = auVar189._4_4_ + fVar211 * auVar111._4_4_;
                          auVar216._8_4_ = auVar189._8_4_ + fVar211 * auVar111._8_4_;
                          auVar216._12_4_ = auVar189._12_4_ + fVar211 * auVar111._12_4_;
                          auVar161 = vunpcklps_avx(auVar143,auVar127);
                          auVar111 = vunpckhps_avx(auVar143,auVar127);
                          auVar109 = vunpcklps_avx(auVar246,auVar113);
                          auVar110 = vunpckhps_avx(auVar246,auVar113);
                          auVar140 = vunpcklps_avx(auVar111,auVar110);
                          auVar160 = vunpcklps_avx(auVar161,auVar109);
                          auVar111 = vunpckhps_avx(auVar161,auVar109);
                          auVar109 = vunpcklps_avx(auVar246,auVar192);
                          auVar110 = vunpckhps_avx(auVar246,auVar192);
                          auVar139 = vunpcklps_avx(auVar175,auVar127);
                          auVar161 = vunpckhps_avx(auVar175,auVar127);
                          auVar172 = vunpcklps_avx(auVar110,auVar161);
                          auVar189 = vunpcklps_avx(auVar109,auVar139);
                          auVar110 = vunpckhps_avx(auVar109,auVar139);
                          auVar139 = vunpcklps_avx(auVar127,auVar216);
                          auVar161 = vunpckhps_avx(auVar127,auVar216);
                          auVar203 = vunpcklps_avx(auVar192,auVar205);
                          auVar109 = vunpckhps_avx(auVar192,auVar205);
                          auVar213 = vunpcklps_avx(auVar161,auVar109);
                          auVar141 = vunpcklps_avx(auVar139,auVar203);
                          auVar161 = vunpckhps_avx(auVar139,auVar203);
                          auVar203 = vunpcklps_avx(auVar113,auVar205);
                          auVar109 = vunpckhps_avx(auVar113,auVar205);
                          auVar142 = vunpcklps_avx(auVar127,auVar164);
                          auVar139 = vunpckhps_avx(auVar127,auVar164);
                          auVar139 = vunpcklps_avx(auVar109,auVar139);
                          auVar162 = vunpcklps_avx(auVar203,auVar142);
                          auVar109 = vunpckhps_avx(auVar203,auVar142);
                          auVar208._16_16_ = auVar141;
                          auVar208._0_16_ = auVar160;
                          auVar219._16_16_ = auVar161;
                          auVar219._0_16_ = auVar111;
                          auVar148._16_16_ = auVar213;
                          auVar148._0_16_ = auVar140;
                          auVar235._16_16_ = auVar189;
                          auVar235._0_16_ = auVar189;
                          auVar247._16_16_ = auVar110;
                          auVar247._0_16_ = auVar110;
                          auVar180._16_16_ = auVar172;
                          auVar180._0_16_ = auVar172;
                          auVar258._16_16_ = auVar162;
                          auVar258._0_16_ = auVar162;
                          auVar170._16_16_ = auVar109;
                          auVar170._0_16_ = auVar109;
                          auVar265._16_16_ = auVar139;
                          auVar265._0_16_ = auVar139;
                          uVar101 = *(undefined4 *)(local_2e20 + lVar98 * 4);
                          auVar269._4_4_ = uVar101;
                          auVar269._0_4_ = uVar101;
                          auVar269._8_4_ = uVar101;
                          auVar269._12_4_ = uVar101;
                          auVar269._16_4_ = uVar101;
                          auVar269._20_4_ = uVar101;
                          auVar269._24_4_ = uVar101;
                          auVar269._28_4_ = uVar101;
                          uVar101 = *(undefined4 *)(local_2e20 + lVar98 * 4 + 0x20);
                          auVar288._4_4_ = uVar101;
                          auVar288._0_4_ = uVar101;
                          auVar288._8_4_ = uVar101;
                          auVar288._12_4_ = uVar101;
                          auVar288._16_4_ = uVar101;
                          auVar288._20_4_ = uVar101;
                          auVar288._24_4_ = uVar101;
                          auVar288._28_4_ = uVar101;
                          uVar101 = *(undefined4 *)(local_2e20 + lVar98 * 4 + 0x40);
                          auVar290._4_4_ = uVar101;
                          auVar290._0_4_ = uVar101;
                          auVar290._8_4_ = uVar101;
                          auVar290._12_4_ = uVar101;
                          auVar290._16_4_ = uVar101;
                          auVar290._20_4_ = uVar101;
                          auVar290._24_4_ = uVar101;
                          auVar290._28_4_ = uVar101;
                          local_2d40 = vsubps_avx(auVar208,auVar269);
                          local_2680 = vsubps_avx(auVar219,auVar288);
                          local_26a0 = vsubps_avx(auVar148,auVar290);
                          auVar114 = vsubps_avx(auVar235,auVar269);
                          auVar166 = vsubps_avx(auVar247,auVar288);
                          auVar129 = vsubps_avx(auVar180,auVar290);
                          auVar165 = vsubps_avx(auVar258,auVar269);
                          auVar176 = vsubps_avx(auVar170,auVar288);
                          auVar194 = vsubps_avx(auVar265,auVar290);
                          local_26c0 = vsubps_avx(auVar165,local_2d40);
                          local_26e0 = vsubps_avx(auVar176,local_2680);
                          local_2700 = vsubps_avx(auVar194,local_26a0);
                          fVar154 = local_2680._0_4_;
                          fVar211 = auVar176._0_4_ + fVar154;
                          fVar157 = local_2680._4_4_;
                          fVar220 = auVar176._4_4_ + fVar157;
                          fVar183 = local_2680._8_4_;
                          fVar222 = auVar176._8_4_ + fVar183;
                          fVar186 = local_2680._12_4_;
                          fVar224 = auVar176._12_4_ + fVar186;
                          fVar8 = local_2680._16_4_;
                          fVar226 = auVar176._16_4_ + fVar8;
                          fVar11 = local_2680._20_4_;
                          fVar228 = auVar176._20_4_ + fVar11;
                          fVar14 = local_2680._24_4_;
                          fVar230 = auVar176._24_4_ + fVar14;
                          fVar155 = local_26a0._0_4_;
                          fVar244 = auVar194._0_4_ + fVar155;
                          fVar158 = local_26a0._4_4_;
                          fVar249 = auVar194._4_4_ + fVar158;
                          fVar184 = local_26a0._8_4_;
                          fVar250 = auVar194._8_4_ + fVar184;
                          fVar187 = local_26a0._12_4_;
                          fVar251 = auVar194._12_4_ + fVar187;
                          fVar9 = local_26a0._16_4_;
                          fVar252 = auVar194._16_4_ + fVar9;
                          fVar12 = local_26a0._20_4_;
                          fVar253 = auVar194._20_4_ + fVar12;
                          fVar15 = local_26a0._24_4_;
                          fVar254 = auVar194._24_4_ + fVar15;
                          fVar245 = local_26a0._28_4_;
                          fVar255 = auVar194._28_4_ + fVar245;
                          fVar17 = local_2700._0_4_;
                          fVar18 = local_2700._4_4_;
                          auVar40._4_4_ = fVar220 * fVar18;
                          auVar40._0_4_ = fVar211 * fVar17;
                          fVar19 = local_2700._8_4_;
                          auVar40._8_4_ = fVar222 * fVar19;
                          fVar20 = local_2700._12_4_;
                          auVar40._12_4_ = fVar224 * fVar20;
                          fVar21 = local_2700._16_4_;
                          auVar40._16_4_ = fVar226 * fVar21;
                          fVar138 = local_2700._20_4_;
                          auVar40._20_4_ = fVar228 * fVar138;
                          fVar153 = local_2700._24_4_;
                          auVar40._24_4_ = fVar230 * fVar153;
                          auVar40._28_4_ = auVar162._12_4_;
                          fVar297 = local_26e0._0_4_;
                          fVar299 = local_26e0._4_4_;
                          auVar41._4_4_ = fVar299 * fVar249;
                          auVar41._0_4_ = fVar297 * fVar244;
                          fVar301 = local_26e0._8_4_;
                          auVar41._8_4_ = fVar301 * fVar250;
                          fVar303 = local_26e0._12_4_;
                          auVar41._12_4_ = fVar303 * fVar251;
                          fVar305 = local_26e0._16_4_;
                          auVar41._16_4_ = fVar305 * fVar252;
                          fVar307 = local_26e0._20_4_;
                          auVar41._20_4_ = fVar307 * fVar253;
                          fVar309 = local_26e0._24_4_;
                          auVar41._24_4_ = fVar309 * fVar254;
                          auVar41._28_4_ = auVar139._12_4_;
                          auVar195 = vsubps_avx(auVar41,auVar40);
                          fVar156 = local_2d40._0_4_;
                          fVar256 = auVar165._0_4_ + fVar156;
                          fVar159 = local_2d40._4_4_;
                          fVar259 = auVar165._4_4_ + fVar159;
                          fVar185 = local_2d40._8_4_;
                          fVar260 = auVar165._8_4_ + fVar185;
                          fVar188 = local_2d40._12_4_;
                          fVar261 = auVar165._12_4_ + fVar188;
                          fVar10 = local_2d40._16_4_;
                          fVar262 = auVar165._16_4_ + fVar10;
                          fVar13 = local_2d40._20_4_;
                          fVar263 = auVar165._20_4_ + fVar13;
                          fVar16 = local_2d40._24_4_;
                          fVar264 = auVar165._24_4_ + fVar16;
                          fVar266 = local_26c0._0_4_;
                          fVar270 = local_26c0._4_4_;
                          auVar42._4_4_ = fVar270 * fVar249;
                          auVar42._0_4_ = fVar266 * fVar244;
                          fVar273 = local_26c0._8_4_;
                          auVar42._8_4_ = fVar273 * fVar250;
                          fVar276 = local_26c0._12_4_;
                          auVar42._12_4_ = fVar276 * fVar251;
                          fVar279 = local_26c0._16_4_;
                          auVar42._16_4_ = fVar279 * fVar252;
                          fVar282 = local_26c0._20_4_;
                          auVar42._20_4_ = fVar282 * fVar253;
                          fVar285 = local_26c0._24_4_;
                          auVar42._24_4_ = fVar285 * fVar254;
                          auVar42._28_4_ = fVar255;
                          auVar217 = local_2700;
                          auVar43._4_4_ = fVar259 * fVar18;
                          auVar43._0_4_ = fVar256 * fVar17;
                          auVar43._8_4_ = fVar260 * fVar19;
                          auVar43._12_4_ = fVar261 * fVar20;
                          auVar43._16_4_ = fVar262 * fVar21;
                          auVar43._20_4_ = fVar263 * fVar138;
                          auVar43._24_4_ = fVar264 * fVar153;
                          auVar43._28_4_ = auVar139._12_4_;
                          auVar196 = vsubps_avx(auVar43,auVar42);
                          auVar44._4_4_ = fVar259 * fVar299;
                          auVar44._0_4_ = fVar256 * fVar297;
                          auVar44._8_4_ = fVar260 * fVar301;
                          auVar44._12_4_ = fVar261 * fVar303;
                          auVar44._16_4_ = fVar262 * fVar305;
                          auVar44._20_4_ = fVar263 * fVar307;
                          auVar44._24_4_ = fVar264 * fVar309;
                          auVar44._28_4_ = fVar255;
                          auVar45._4_4_ = fVar270 * fVar220;
                          auVar45._0_4_ = fVar266 * fVar211;
                          auVar45._8_4_ = fVar273 * fVar222;
                          auVar45._12_4_ = fVar276 * fVar224;
                          auVar45._16_4_ = fVar279 * fVar226;
                          auVar45._20_4_ = fVar282 * fVar228;
                          auVar45._24_4_ = fVar285 * fVar230;
                          auVar45._28_4_ = auVar176._28_4_ + local_2680._28_4_;
                          auVar206 = vsubps_avx(auVar45,auVar44);
                          local_2ee0._4_4_ = *(float *)(local_2e20 + lVar98 * 4 + 0xa0);
                          fVar211 = *(float *)(local_2e20 + lVar98 * 4 + 0xc0);
                          local_2f00._4_4_ = fVar211;
                          local_2f00._0_4_ = fVar211;
                          local_2f00._8_4_ = fVar211;
                          local_2f00._12_4_ = fVar211;
                          local_2f00._16_4_ = fVar211;
                          local_2f00._20_4_ = fVar211;
                          local_2f00._24_4_ = fVar211;
                          local_2f00._28_4_ = fVar211;
                          auVar152 = ZEXT3264(local_2f00);
                          fStack_2db8 = *(float *)(local_2e20 + lVar98 * 4 + 0x80);
                          local_2760._0_4_ =
                               auVar195._0_4_ * fStack_2db8 +
                               local_2ee0._4_4_ * auVar196._0_4_ + auVar206._0_4_ * fVar211;
                          local_2760._4_4_ =
                               auVar195._4_4_ * fStack_2db8 +
                               local_2ee0._4_4_ * auVar196._4_4_ + auVar206._4_4_ * fVar211;
                          local_2760._8_4_ =
                               auVar195._8_4_ * fStack_2db8 +
                               local_2ee0._4_4_ * auVar196._8_4_ + auVar206._8_4_ * fVar211;
                          local_2760._12_4_ =
                               auVar195._12_4_ * fStack_2db8 +
                               local_2ee0._4_4_ * auVar196._12_4_ + auVar206._12_4_ * fVar211;
                          local_2760._16_4_ =
                               auVar195._16_4_ * fStack_2db8 +
                               local_2ee0._4_4_ * auVar196._16_4_ + auVar206._16_4_ * fVar211;
                          local_2760._20_4_ =
                               auVar195._20_4_ * fStack_2db8 +
                               local_2ee0._4_4_ * auVar196._20_4_ + auVar206._20_4_ * fVar211;
                          local_2760._24_4_ =
                               auVar195._24_4_ * fStack_2db8 +
                               local_2ee0._4_4_ * auVar196._24_4_ + auVar206._24_4_ * fVar211;
                          local_2760._28_4_ = auVar195._28_4_ + auVar196._28_4_ + auVar206._28_4_;
                          local_2720 = vsubps_avx(local_2680,auVar166);
                          local_2740 = vsubps_avx(local_26a0,auVar129);
                          fVar250 = auVar166._0_4_ + fVar154;
                          fVar251 = auVar166._4_4_ + fVar157;
                          fVar252 = auVar166._8_4_ + fVar183;
                          fVar253 = auVar166._12_4_ + fVar186;
                          fVar254 = auVar166._16_4_ + fVar8;
                          fVar255 = auVar166._20_4_ + fVar11;
                          fVar256 = auVar166._24_4_ + fVar14;
                          fVar222 = fVar155 + auVar129._0_4_;
                          fVar224 = fVar158 + auVar129._4_4_;
                          fVar226 = fVar184 + auVar129._8_4_;
                          fVar228 = fVar187 + auVar129._12_4_;
                          fVar230 = fVar9 + auVar129._16_4_;
                          fVar244 = fVar12 + auVar129._20_4_;
                          fVar249 = fVar15 + auVar129._24_4_;
                          fVar220 = auVar129._28_4_;
                          fVar267 = local_2740._0_4_;
                          fVar271 = local_2740._4_4_;
                          auVar46._4_4_ = fVar271 * fVar251;
                          auVar46._0_4_ = fVar267 * fVar250;
                          fVar274 = local_2740._8_4_;
                          auVar46._8_4_ = fVar274 * fVar252;
                          fVar277 = local_2740._12_4_;
                          auVar46._12_4_ = fVar277 * fVar253;
                          fVar280 = local_2740._16_4_;
                          auVar46._16_4_ = fVar280 * fVar254;
                          fVar283 = local_2740._20_4_;
                          auVar46._20_4_ = fVar283 * fVar255;
                          fVar286 = local_2740._24_4_;
                          auVar46._24_4_ = fVar286 * fVar256;
                          auVar46._28_4_ = auVar196._28_4_;
                          fVar298 = local_2720._0_4_;
                          fVar300 = local_2720._4_4_;
                          auVar47._4_4_ = fVar300 * fVar224;
                          auVar47._0_4_ = fVar298 * fVar222;
                          fVar302 = local_2720._8_4_;
                          auVar47._8_4_ = fVar302 * fVar226;
                          fVar304 = local_2720._12_4_;
                          auVar47._12_4_ = fVar304 * fVar228;
                          fVar306 = local_2720._16_4_;
                          auVar47._16_4_ = fVar306 * fVar230;
                          fVar308 = local_2720._20_4_;
                          auVar47._20_4_ = fVar308 * fVar244;
                          fVar310 = local_2720._24_4_;
                          auVar47._24_4_ = fVar310 * fVar249;
                          auVar47._28_4_ = fVar245;
                          auVar195 = vsubps_avx(auVar47,auVar46);
                          auVar196 = vsubps_avx(local_2d40,auVar114);
                          fVar289 = auVar196._0_4_;
                          fVar291 = auVar196._4_4_;
                          auVar48._4_4_ = fVar291 * fVar224;
                          auVar48._0_4_ = fVar289 * fVar222;
                          fVar292 = auVar196._8_4_;
                          auVar48._8_4_ = fVar292 * fVar226;
                          fVar293 = auVar196._12_4_;
                          auVar48._12_4_ = fVar293 * fVar228;
                          fVar294 = auVar196._16_4_;
                          auVar48._16_4_ = fVar294 * fVar230;
                          fVar295 = auVar196._20_4_;
                          auVar48._20_4_ = fVar295 * fVar244;
                          fVar296 = auVar196._24_4_;
                          auVar48._24_4_ = fVar296 * fVar249;
                          auVar48._28_4_ = fVar245 + fVar220;
                          fVar245 = fVar156 + auVar114._0_4_;
                          fVar222 = fVar159 + auVar114._4_4_;
                          fVar224 = fVar185 + auVar114._8_4_;
                          fVar226 = fVar188 + auVar114._12_4_;
                          fVar228 = fVar10 + auVar114._16_4_;
                          fVar230 = fVar13 + auVar114._20_4_;
                          fVar244 = fVar16 + auVar114._24_4_;
                          auVar49._4_4_ = fVar222 * fVar271;
                          auVar49._0_4_ = fVar245 * fVar267;
                          auVar49._8_4_ = fVar224 * fVar274;
                          auVar49._12_4_ = fVar226 * fVar277;
                          auVar49._16_4_ = fVar228 * fVar280;
                          auVar49._20_4_ = fVar230 * fVar283;
                          auVar49._24_4_ = fVar244 * fVar286;
                          auVar49._28_4_ = local_2740._28_4_;
                          auVar196 = vsubps_avx(auVar49,auVar48);
                          auVar50._4_4_ = fVar222 * fVar300;
                          auVar50._0_4_ = fVar245 * fVar298;
                          auVar50._8_4_ = fVar224 * fVar302;
                          auVar50._12_4_ = fVar226 * fVar304;
                          auVar50._16_4_ = fVar228 * fVar306;
                          auVar50._20_4_ = fVar230 * fVar308;
                          auVar50._24_4_ = fVar244 * fVar310;
                          auVar50._28_4_ = local_2d40._28_4_ + auVar114._28_4_;
                          auVar51._4_4_ = fVar291 * fVar251;
                          auVar51._0_4_ = fVar289 * fVar250;
                          auVar51._8_4_ = fVar292 * fVar252;
                          auVar51._12_4_ = fVar293 * fVar253;
                          auVar51._16_4_ = fVar294 * fVar254;
                          auVar51._20_4_ = fVar295 * fVar255;
                          auVar51._24_4_ = fVar296 * fVar256;
                          auVar51._28_4_ = auVar166._28_4_ + local_2680._28_4_;
                          auVar206 = vsubps_avx(auVar51,auVar50);
                          fVar202 = auVar206._28_4_ + auVar196._28_4_;
                          local_2780._0_4_ =
                               fStack_2db8 * auVar195._0_4_ +
                               auVar206._0_4_ * fVar211 + local_2ee0._4_4_ * auVar196._0_4_;
                          local_2780._4_4_ =
                               fStack_2db8 * auVar195._4_4_ +
                               auVar206._4_4_ * fVar211 + local_2ee0._4_4_ * auVar196._4_4_;
                          local_2780._8_4_ =
                               fStack_2db8 * auVar195._8_4_ +
                               auVar206._8_4_ * fVar211 + local_2ee0._4_4_ * auVar196._8_4_;
                          local_2780._12_4_ =
                               fStack_2db8 * auVar195._12_4_ +
                               auVar206._12_4_ * fVar211 + local_2ee0._4_4_ * auVar196._12_4_;
                          local_2780._16_4_ =
                               fStack_2db8 * auVar195._16_4_ +
                               auVar206._16_4_ * fVar211 + local_2ee0._4_4_ * auVar196._16_4_;
                          local_2780._20_4_ =
                               fStack_2db8 * auVar195._20_4_ +
                               auVar206._20_4_ * fVar211 + local_2ee0._4_4_ * auVar196._20_4_;
                          local_2780._24_4_ =
                               fStack_2db8 * auVar195._24_4_ +
                               auVar206._24_4_ * fVar211 + local_2ee0._4_4_ * auVar196._24_4_;
                          local_2780._28_4_ = auVar195._28_4_ + fVar202;
                          auVar195 = vsubps_avx(auVar114,auVar165);
                          fVar256 = auVar114._0_4_ + auVar165._0_4_;
                          fVar259 = auVar114._4_4_ + auVar165._4_4_;
                          fVar260 = auVar114._8_4_ + auVar165._8_4_;
                          fVar261 = auVar114._12_4_ + auVar165._12_4_;
                          fVar262 = auVar114._16_4_ + auVar165._16_4_;
                          fVar263 = auVar114._20_4_ + auVar165._20_4_;
                          fVar264 = auVar114._24_4_ + auVar165._24_4_;
                          auVar196 = vsubps_avx(auVar166,auVar176);
                          fVar249 = auVar166._0_4_ + auVar176._0_4_;
                          fVar250 = auVar166._4_4_ + auVar176._4_4_;
                          fVar251 = auVar166._8_4_ + auVar176._8_4_;
                          fVar252 = auVar166._12_4_ + auVar176._12_4_;
                          fVar253 = auVar166._16_4_ + auVar176._16_4_;
                          fVar254 = auVar166._20_4_ + auVar176._20_4_;
                          fVar255 = auVar166._24_4_ + auVar176._24_4_;
                          auVar206 = vsubps_avx(auVar129,auVar194);
                          fVar245 = auVar129._0_4_ + auVar194._0_4_;
                          fVar222 = auVar129._4_4_ + auVar194._4_4_;
                          fVar224 = auVar129._8_4_ + auVar194._8_4_;
                          fVar226 = auVar129._12_4_ + auVar194._12_4_;
                          fVar228 = auVar129._16_4_ + auVar194._16_4_;
                          fVar230 = auVar129._20_4_ + auVar194._20_4_;
                          fVar244 = auVar129._24_4_ + auVar194._24_4_;
                          fVar232 = auVar206._0_4_;
                          fVar238 = auVar206._4_4_;
                          auVar52._4_4_ = fVar238 * fVar250;
                          auVar52._0_4_ = fVar232 * fVar249;
                          fVar239 = auVar206._8_4_;
                          auVar52._8_4_ = fVar239 * fVar251;
                          fVar240 = auVar206._12_4_;
                          auVar52._12_4_ = fVar240 * fVar252;
                          fVar241 = auVar206._16_4_;
                          auVar52._16_4_ = fVar241 * fVar253;
                          fVar242 = auVar206._20_4_;
                          auVar52._20_4_ = fVar242 * fVar254;
                          fVar243 = auVar206._24_4_;
                          auVar52._24_4_ = fVar243 * fVar255;
                          auVar52._28_4_ = fVar220;
                          fVar268 = auVar196._0_4_;
                          fVar272 = auVar196._4_4_;
                          auVar53._4_4_ = fVar272 * fVar222;
                          auVar53._0_4_ = fVar268 * fVar245;
                          fVar275 = auVar196._8_4_;
                          auVar53._8_4_ = fVar275 * fVar224;
                          fVar278 = auVar196._12_4_;
                          auVar53._12_4_ = fVar278 * fVar226;
                          fVar281 = auVar196._16_4_;
                          auVar53._16_4_ = fVar281 * fVar228;
                          fVar284 = auVar196._20_4_;
                          auVar53._20_4_ = fVar284 * fVar230;
                          fVar287 = auVar196._24_4_;
                          auVar53._24_4_ = fVar287 * fVar244;
                          auVar53._28_4_ = fVar202;
                          auVar129 = vsubps_avx(auVar53,auVar52);
                          fVar212 = auVar195._0_4_;
                          fVar221 = auVar195._4_4_;
                          auVar54._4_4_ = fVar221 * fVar222;
                          auVar54._0_4_ = fVar212 * fVar245;
                          fVar223 = auVar195._8_4_;
                          auVar54._8_4_ = fVar223 * fVar224;
                          fVar225 = auVar195._12_4_;
                          auVar54._12_4_ = fVar225 * fVar226;
                          fVar227 = auVar195._16_4_;
                          auVar54._16_4_ = fVar227 * fVar228;
                          fVar229 = auVar195._20_4_;
                          auVar54._20_4_ = fVar229 * fVar230;
                          fVar231 = auVar195._24_4_;
                          auVar54._24_4_ = fVar231 * fVar244;
                          auVar54._28_4_ = fVar220 + auVar194._28_4_;
                          auVar55._4_4_ = fVar238 * fVar259;
                          auVar55._0_4_ = fVar232 * fVar256;
                          auVar55._8_4_ = fVar239 * fVar260;
                          auVar55._12_4_ = fVar240 * fVar261;
                          auVar55._16_4_ = fVar241 * fVar262;
                          auVar55._20_4_ = fVar242 * fVar263;
                          auVar55._24_4_ = fVar243 * fVar264;
                          auVar55._28_4_ = fVar202;
                          auVar194 = vsubps_avx(auVar55,auVar54);
                          auVar56._4_4_ = fVar272 * fVar259;
                          auVar56._0_4_ = fVar268 * fVar256;
                          auVar56._8_4_ = fVar275 * fVar260;
                          auVar56._12_4_ = fVar278 * fVar261;
                          auVar56._16_4_ = fVar281 * fVar262;
                          auVar56._20_4_ = fVar284 * fVar263;
                          auVar56._24_4_ = fVar287 * fVar264;
                          auVar56._28_4_ = auVar114._28_4_ + auVar165._28_4_;
                          auVar57._4_4_ = fVar221 * fVar250;
                          auVar57._0_4_ = fVar212 * fVar249;
                          auVar57._8_4_ = fVar223 * fVar251;
                          auVar57._12_4_ = fVar225 * fVar252;
                          auVar57._16_4_ = fVar227 * fVar253;
                          auVar57._20_4_ = fVar229 * fVar254;
                          auVar57._24_4_ = fVar231 * fVar255;
                          auVar57._28_4_ = auVar166._28_4_ + auVar176._28_4_;
                          auVar114 = vsubps_avx(auVar57,auVar56);
                          local_2ee0._0_4_ = local_2ee0._4_4_;
                          fStack_2ed8 = local_2ee0._4_4_;
                          fStack_2ed4 = local_2ee0._4_4_;
                          fStack_2ed0 = local_2ee0._4_4_;
                          fStack_2ecc = local_2ee0._4_4_;
                          fStack_2ec8 = local_2ee0._4_4_;
                          fStack_2ec4 = local_2ee0._4_4_;
                          auVar133._0_4_ =
                               fStack_2db8 * auVar129._0_4_ +
                               auVar114._0_4_ * fVar211 + local_2ee0._4_4_ * auVar194._0_4_;
                          auVar133._4_4_ =
                               fStack_2db8 * auVar129._4_4_ +
                               auVar114._4_4_ * fVar211 + local_2ee0._4_4_ * auVar194._4_4_;
                          auVar133._8_4_ =
                               fStack_2db8 * auVar129._8_4_ +
                               auVar114._8_4_ * fVar211 + local_2ee0._4_4_ * auVar194._8_4_;
                          auVar133._12_4_ =
                               fStack_2db8 * auVar129._12_4_ +
                               auVar114._12_4_ * fVar211 + local_2ee0._4_4_ * auVar194._12_4_;
                          auVar133._16_4_ =
                               fStack_2db8 * auVar129._16_4_ +
                               auVar114._16_4_ * fVar211 + local_2ee0._4_4_ * auVar194._16_4_;
                          auVar133._20_4_ =
                               fStack_2db8 * auVar129._20_4_ +
                               auVar114._20_4_ * fVar211 + local_2ee0._4_4_ * auVar194._20_4_;
                          auVar133._24_4_ =
                               fStack_2db8 * auVar129._24_4_ +
                               auVar114._24_4_ * fVar211 + local_2ee0._4_4_ * auVar194._24_4_;
                          auVar133._28_4_ = auVar114._28_4_ + auVar114._28_4_ + auVar194._28_4_;
                          local_2ea0._0_4_ = auVar133._0_4_ + local_2760._0_4_ + local_2780._0_4_;
                          local_2ea0._4_4_ = auVar133._4_4_ + local_2760._4_4_ + local_2780._4_4_;
                          local_2ea0._8_4_ = auVar133._8_4_ + local_2760._8_4_ + local_2780._8_4_;
                          local_2ea0._12_4_ =
                               auVar133._12_4_ + local_2760._12_4_ + local_2780._12_4_;
                          local_2ea0._16_4_ =
                               auVar133._16_4_ + local_2760._16_4_ + local_2780._16_4_;
                          local_2ea0._20_4_ =
                               auVar133._20_4_ + local_2760._20_4_ + local_2780._20_4_;
                          local_2ea0._24_4_ =
                               auVar133._24_4_ + local_2760._24_4_ + local_2780._24_4_;
                          local_2ea0._28_4_ =
                               auVar133._28_4_ + local_2760._28_4_ + local_2780._28_4_;
                          auVar114 = vminps_avx(local_2760,local_2780);
                          auVar114 = vminps_avx(auVar114,auVar133);
                          auVar181._8_4_ = 0x7fffffff;
                          auVar181._0_8_ = 0x7fffffff7fffffff;
                          auVar181._12_4_ = 0x7fffffff;
                          auVar181._16_4_ = 0x7fffffff;
                          auVar181._20_4_ = 0x7fffffff;
                          auVar181._24_4_ = 0x7fffffff;
                          auVar181._28_4_ = 0x7fffffff;
                          local_27e0 = vandps_avx(local_2ea0,auVar181);
                          fVar245 = local_27e0._0_4_ * 1.1920929e-07;
                          fVar220 = local_27e0._4_4_ * 1.1920929e-07;
                          auVar58._4_4_ = fVar220;
                          auVar58._0_4_ = fVar245;
                          fVar222 = local_27e0._8_4_ * 1.1920929e-07;
                          auVar58._8_4_ = fVar222;
                          fVar224 = local_27e0._12_4_ * 1.1920929e-07;
                          auVar58._12_4_ = fVar224;
                          fVar226 = local_27e0._16_4_ * 1.1920929e-07;
                          auVar58._16_4_ = fVar226;
                          fVar228 = local_27e0._20_4_ * 1.1920929e-07;
                          auVar58._20_4_ = fVar228;
                          fVar230 = local_27e0._24_4_ * 1.1920929e-07;
                          auVar58._24_4_ = fVar230;
                          auVar58._28_4_ = 0x34000000;
                          auVar199._0_8_ = CONCAT44(fVar220,fVar245) ^ 0x8000000080000000;
                          auVar199._8_4_ = -fVar222;
                          auVar199._12_4_ = -fVar224;
                          auVar199._16_4_ = -fVar226;
                          auVar199._20_4_ = -fVar228;
                          auVar199._24_4_ = -fVar230;
                          auVar199._28_4_ = 0xb4000000;
                          auVar114 = vcmpps_avx(auVar114,auVar199,5);
                          auVar165 = vmaxps_avx(local_2760,local_2780);
                          auVar129 = vmaxps_avx(auVar165,auVar133);
                          auVar129 = vcmpps_avx(auVar129,auVar58,2);
                          auVar114 = vorps_avx(auVar114,auVar129);
                          fStack_2db4 = fStack_2db8;
                          fStack_2db0 = fStack_2db8;
                          fStack_2dac = fStack_2db8;
                          fStack_2da8 = fStack_2db8;
                          fStack_2da4 = fStack_2db8;
                          local_2700 = auVar217;
                          local_2dc0 = (undefined1 (*) [16])CONCAT44(fStack_2db8,fStack_2db8);
                          if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar114 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar114 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar114 >> 0x7f,0) != '\0') ||
                                (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar114 >> 0xbf,0) != '\0') ||
                              (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar114[0x1f] < '\0') {
                            auVar59._4_4_ = fVar300 * fVar18;
                            auVar59._0_4_ = fVar298 * fVar17;
                            auVar59._8_4_ = fVar302 * fVar19;
                            auVar59._12_4_ = fVar304 * fVar20;
                            auVar59._16_4_ = fVar306 * fVar21;
                            auVar59._20_4_ = fVar308 * fVar138;
                            auVar59._24_4_ = fVar310 * fVar153;
                            auVar59._28_4_ = auVar129._28_4_;
                            auVar60._4_4_ = fVar271 * fVar299;
                            auVar60._0_4_ = fVar267 * fVar297;
                            auVar60._8_4_ = fVar274 * fVar301;
                            auVar60._12_4_ = fVar277 * fVar303;
                            auVar60._16_4_ = fVar280 * fVar305;
                            auVar60._20_4_ = fVar283 * fVar307;
                            auVar60._24_4_ = fVar286 * fVar309;
                            auVar60._28_4_ = 0x34000000;
                            auVar166 = vsubps_avx(auVar60,auVar59);
                            auVar61._4_4_ = fVar272 * fVar271;
                            auVar61._0_4_ = fVar268 * fVar267;
                            auVar61._8_4_ = fVar275 * fVar274;
                            auVar61._12_4_ = fVar278 * fVar277;
                            auVar61._16_4_ = fVar281 * fVar280;
                            auVar61._20_4_ = fVar284 * fVar283;
                            auVar61._24_4_ = fVar287 * fVar286;
                            auVar61._28_4_ = auVar165._28_4_;
                            auVar62._4_4_ = fVar300 * fVar238;
                            auVar62._0_4_ = fVar298 * fVar232;
                            auVar62._8_4_ = fVar302 * fVar239;
                            auVar62._12_4_ = fVar304 * fVar240;
                            auVar62._16_4_ = fVar306 * fVar241;
                            auVar62._20_4_ = fVar308 * fVar242;
                            auVar62._24_4_ = fVar310 * fVar243;
                            auVar62._28_4_ = local_2780._28_4_;
                            auVar194 = vsubps_avx(auVar62,auVar61);
                            auVar248._8_4_ = 0x7fffffff;
                            auVar248._0_8_ = 0x7fffffff7fffffff;
                            auVar248._12_4_ = 0x7fffffff;
                            auVar248._16_4_ = 0x7fffffff;
                            auVar248._20_4_ = 0x7fffffff;
                            auVar248._24_4_ = 0x7fffffff;
                            auVar248._28_4_ = 0x7fffffff;
                            auVar129 = vandps_avx(auVar248,auVar59);
                            auVar165 = vandps_avx(auVar248,auVar61);
                            auVar129 = vcmpps_avx(auVar129,auVar165,1);
                            auVar176 = vblendvps_avx(auVar194,auVar166,auVar129);
                            auVar63._4_4_ = fVar291 * fVar238;
                            auVar63._0_4_ = fVar289 * fVar232;
                            auVar63._8_4_ = fVar292 * fVar239;
                            auVar63._12_4_ = fVar293 * fVar240;
                            auVar63._16_4_ = fVar294 * fVar241;
                            auVar63._20_4_ = fVar295 * fVar242;
                            auVar63._24_4_ = fVar296 * fVar243;
                            auVar63._28_4_ = auVar166._28_4_;
                            auVar64._4_4_ = fVar291 * fVar18;
                            auVar64._0_4_ = fVar289 * fVar17;
                            auVar64._8_4_ = fVar292 * fVar19;
                            auVar64._12_4_ = fVar293 * fVar20;
                            auVar64._16_4_ = fVar294 * fVar21;
                            auVar64._20_4_ = fVar295 * fVar138;
                            auVar64._24_4_ = fVar296 * fVar153;
                            auVar64._28_4_ = auVar165._28_4_;
                            auVar65._4_4_ = fVar270 * fVar271;
                            auVar65._0_4_ = fVar266 * fVar267;
                            auVar65._8_4_ = fVar273 * fVar274;
                            auVar65._12_4_ = fVar276 * fVar277;
                            auVar65._16_4_ = fVar279 * fVar280;
                            auVar65._20_4_ = fVar282 * fVar283;
                            auVar65._24_4_ = fVar285 * fVar286;
                            auVar65._28_4_ = auVar194._28_4_;
                            auVar194 = vsubps_avx(auVar64,auVar65);
                            auVar66._4_4_ = fVar271 * fVar221;
                            auVar66._0_4_ = fVar267 * fVar212;
                            auVar66._8_4_ = fVar274 * fVar223;
                            auVar66._12_4_ = fVar277 * fVar225;
                            auVar66._16_4_ = fVar280 * fVar227;
                            auVar66._20_4_ = fVar283 * fVar229;
                            auVar66._24_4_ = fVar286 * fVar231;
                            auVar66._28_4_ = auVar206._28_4_;
                            auVar166 = vsubps_avx(auVar66,auVar63);
                            auVar129 = vandps_avx(auVar248,auVar65);
                            auVar165 = vandps_avx(auVar248,auVar63);
                            auVar165 = vcmpps_avx(auVar129,auVar165,1);
                            auVar166 = vblendvps_avx(auVar166,auVar194,auVar165);
                            auVar67._4_4_ = fVar300 * fVar221;
                            auVar67._0_4_ = fVar298 * fVar212;
                            auVar67._8_4_ = fVar302 * fVar223;
                            auVar67._12_4_ = fVar304 * fVar225;
                            auVar67._16_4_ = fVar306 * fVar227;
                            auVar67._20_4_ = fVar308 * fVar229;
                            auVar67._24_4_ = fVar310 * fVar231;
                            auVar67._28_4_ = auVar165._28_4_;
                            auVar68._4_4_ = fVar270 * fVar300;
                            auVar68._0_4_ = fVar266 * fVar298;
                            auVar68._8_4_ = fVar273 * fVar302;
                            auVar68._12_4_ = fVar276 * fVar304;
                            auVar68._16_4_ = fVar279 * fVar306;
                            auVar68._20_4_ = fVar282 * fVar308;
                            auVar68._24_4_ = fVar285 * fVar310;
                            auVar68._28_4_ = auVar194._28_4_;
                            auVar69._4_4_ = fVar291 * fVar299;
                            auVar69._0_4_ = fVar289 * fVar297;
                            auVar69._8_4_ = fVar292 * fVar301;
                            auVar69._12_4_ = fVar293 * fVar303;
                            auVar69._16_4_ = fVar294 * fVar305;
                            auVar69._20_4_ = fVar295 * fVar307;
                            auVar69._24_4_ = fVar296 * fVar309;
                            auVar69._28_4_ = auVar129._28_4_;
                            auVar70._4_4_ = fVar291 * fVar272;
                            auVar70._0_4_ = fVar289 * fVar268;
                            auVar70._8_4_ = fVar292 * fVar275;
                            auVar70._12_4_ = fVar293 * fVar278;
                            auVar70._16_4_ = fVar294 * fVar281;
                            auVar70._20_4_ = fVar295 * fVar284;
                            auVar70._24_4_ = fVar296 * fVar287;
                            auVar70._28_4_ = local_2700._28_4_;
                            auVar194 = vsubps_avx(auVar68,auVar69);
                            auVar206 = vsubps_avx(auVar70,auVar67);
                            auVar129 = vandps_avx(auVar248,auVar69);
                            auVar165 = vandps_avx(auVar248,auVar67);
                            auVar165 = vcmpps_avx(auVar129,auVar165,1);
                            auVar165 = vblendvps_avx(auVar206,auVar194,auVar165);
                            auVar152 = ZEXT3264(auVar165);
                            auVar111 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
                            fVar138 = auVar165._0_4_;
                            fVar153 = auVar165._4_4_;
                            fVar222 = auVar165._8_4_;
                            fVar224 = auVar165._12_4_;
                            fVar226 = auVar165._16_4_;
                            fVar228 = auVar165._20_4_;
                            fVar230 = auVar165._24_4_;
                            fVar255 = auVar166._0_4_;
                            fVar256 = auVar166._4_4_;
                            fVar259 = auVar166._8_4_;
                            fVar260 = auVar166._12_4_;
                            fVar261 = auVar166._16_4_;
                            fVar262 = auVar166._20_4_;
                            fVar263 = auVar166._24_4_;
                            fVar245 = auVar176._0_4_;
                            fVar220 = auVar176._4_4_;
                            fVar17 = auVar176._8_4_;
                            fVar18 = auVar176._12_4_;
                            fVar19 = auVar176._16_4_;
                            fVar20 = auVar176._20_4_;
                            fVar21 = auVar176._24_4_;
                            fVar244 = fStack_2db8 * fVar245 +
                                      fVar138 * fVar211 + fVar255 * local_2ee0._4_4_;
                            fVar249 = fStack_2db8 * fVar220 +
                                      fVar153 * fVar211 + fVar256 * local_2ee0._4_4_;
                            fVar250 = fStack_2db8 * fVar17 +
                                      fVar222 * fVar211 + fVar259 * local_2ee0._4_4_;
                            fVar251 = fStack_2db8 * fVar18 +
                                      fVar224 * fVar211 + fVar260 * local_2ee0._4_4_;
                            fVar252 = fStack_2db8 * fVar19 +
                                      fVar226 * fVar211 + fVar261 * local_2ee0._4_4_;
                            fVar253 = fStack_2db8 * fVar20 +
                                      fVar228 * fVar211 + fVar262 * local_2ee0._4_4_;
                            fVar211 = fStack_2db8 * fVar21 +
                                      fVar230 * fVar211 + fVar263 * local_2ee0._4_4_;
                            fVar254 = auVar114._28_4_ + 0.0 + 0.0;
                            auVar171._0_4_ = fVar244 + fVar244;
                            auVar171._4_4_ = fVar249 + fVar249;
                            auVar171._8_4_ = fVar250 + fVar250;
                            auVar171._12_4_ = fVar251 + fVar251;
                            auVar171._16_4_ = fVar252 + fVar252;
                            auVar171._20_4_ = fVar253 + fVar253;
                            auVar171._24_4_ = fVar211 + fVar211;
                            auVar171._28_4_ = fVar254 + fVar254;
                            fVar244 = fVar245 * fVar156 + fVar138 * fVar155 + fVar255 * fVar154;
                            fVar249 = fVar220 * fVar159 + fVar153 * fVar158 + fVar256 * fVar157;
                            fVar183 = fVar17 * fVar185 + fVar222 * fVar184 + fVar259 * fVar183;
                            fVar184 = fVar18 * fVar188 + fVar224 * fVar187 + fVar260 * fVar186;
                            fVar185 = fVar19 * fVar10 + fVar226 * fVar9 + fVar261 * fVar8;
                            fVar186 = fVar20 * fVar13 + fVar228 * fVar12 + fVar262 * fVar11;
                            fVar187 = fVar21 * fVar16 + fVar230 * fVar15 + fVar263 * fVar14;
                            fVar188 = auVar129._28_4_ + auVar129._28_4_ + 0.0;
                            auVar114 = vrcpps_avx(auVar171);
                            fVar211 = auVar114._0_4_;
                            fVar154 = auVar114._4_4_;
                            auVar71._4_4_ = auVar171._4_4_ * fVar154;
                            auVar71._0_4_ = auVar171._0_4_ * fVar211;
                            fVar155 = auVar114._8_4_;
                            auVar71._8_4_ = auVar171._8_4_ * fVar155;
                            fVar156 = auVar114._12_4_;
                            auVar71._12_4_ = auVar171._12_4_ * fVar156;
                            fVar157 = auVar114._16_4_;
                            auVar71._16_4_ = auVar171._16_4_ * fVar157;
                            fVar158 = auVar114._20_4_;
                            auVar71._20_4_ = auVar171._20_4_ * fVar158;
                            fVar159 = auVar114._24_4_;
                            auVar71._24_4_ = auVar171._24_4_ * fVar159;
                            auVar71._28_4_ = auVar195._28_4_;
                            auVar236._8_4_ = 0x3f800000;
                            auVar236._0_8_ = 0x3f8000003f800000;
                            auVar236._12_4_ = 0x3f800000;
                            auVar236._16_4_ = 0x3f800000;
                            auVar236._20_4_ = 0x3f800000;
                            auVar236._24_4_ = 0x3f800000;
                            auVar236._28_4_ = 0x3f800000;
                            auVar114 = vsubps_avx(auVar236,auVar71);
                            auVar72._4_4_ =
                                 (fVar249 + fVar249) * (fVar154 + fVar154 * auVar114._4_4_);
                            auVar72._0_4_ =
                                 (fVar244 + fVar244) * (fVar211 + fVar211 * auVar114._0_4_);
                            auVar72._8_4_ =
                                 (fVar183 + fVar183) * (fVar155 + fVar155 * auVar114._8_4_);
                            auVar72._12_4_ =
                                 (fVar184 + fVar184) * (fVar156 + fVar156 * auVar114._12_4_);
                            auVar72._16_4_ =
                                 (fVar185 + fVar185) * (fVar157 + fVar157 * auVar114._16_4_);
                            auVar72._20_4_ =
                                 (fVar186 + fVar186) * (fVar158 + fVar158 * auVar114._20_4_);
                            auVar72._24_4_ =
                                 (fVar187 + fVar187) * (fVar159 + fVar159 * auVar114._24_4_);
                            auVar72._28_4_ = fVar188 + fVar188;
                            uVar101 = *(undefined4 *)(local_2e20 + lVar98 * 4 + 0x60);
                            auVar209._4_4_ = uVar101;
                            auVar209._0_4_ = uVar101;
                            auVar209._8_4_ = uVar101;
                            auVar209._12_4_ = uVar101;
                            auVar209._16_4_ = uVar101;
                            auVar209._20_4_ = uVar101;
                            auVar209._24_4_ = uVar101;
                            auVar209._28_4_ = uVar101;
                            auVar114 = vcmpps_avx(auVar209,auVar72,2);
                            uVar101 = *(undefined4 *)(local_2e20 + lVar98 * 4 + 0x100);
                            auVar237._4_4_ = uVar101;
                            auVar237._0_4_ = uVar101;
                            auVar237._8_4_ = uVar101;
                            auVar237._12_4_ = uVar101;
                            auVar237._16_4_ = uVar101;
                            auVar237._20_4_ = uVar101;
                            auVar237._24_4_ = uVar101;
                            auVar237._28_4_ = uVar101;
                            auVar136 = ZEXT3264(auVar237);
                            auVar129 = vcmpps_avx(auVar72,auVar237,2);
                            auVar114 = vandps_avx(auVar129,auVar114);
                            auVar110 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
                            auVar111 = vpand_avx(auVar110,auVar111);
                            auVar110 = vpmovsxwd_avx(auVar111);
                            auVar161 = vpshufd_avx(auVar111,0xee);
                            auVar161 = vpmovsxwd_avx(auVar161);
                            auVar210._16_16_ = auVar161;
                            auVar210._0_16_ = auVar110;
                            auVar166 = local_2ea0;
                            if ((((((((auVar210 >> 0x1f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0 ||
                                     (auVar210 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar210 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar210 >> 0x7f,0) != '\0') ||
                                  (auVar210 & (undefined1  [32])0x100000000) !=
                                  (undefined1  [32])0x0) || SUB161(auVar161 >> 0x3f,0) != '\0') ||
                                (auVar210 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                                || auVar161[0xf] < '\0') {
                              auVar114 = vcmpps_avx(auVar171,_DAT_01f7b000,4);
                              auVar110 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
                              auVar111 = vpand_avx(auVar111,auVar110);
                              auVar110 = vpmovsxwd_avx(auVar111);
                              auVar161 = vpunpckhwd_avx(auVar111,auVar111);
                              auVar200._16_16_ = auVar161;
                              auVar200._0_16_ = auVar110;
                              local_2dc0 = (undefined1 (*) [16])CONCAT44(fStack_2db8,fStack_2db8);
                              if ((((((((auVar200 >> 0x1f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar200 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar200 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar200 >> 0x7f,0) != '\0')
                                    || (auVar200 & (undefined1  [32])0x100000000) !=
                                       (undefined1  [32])0x0) || SUB161(auVar161 >> 0x3f,0) != '\0')
                                  || (auVar200 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0) || auVar161[0xf] < '\0') {
                                local_2ae0 = local_2ea0;
                                local_2ac0 = &local_2f41;
                                local_2aa0 = auVar200;
                                local_2a40 = auVar72;
                                auVar114 = vsubps_avx(local_2ea0,local_2780);
                                auVar114 = vblendvps_avx(local_2760,auVar114,local_2800);
                                auVar129 = vsubps_avx(local_2ea0,local_2760);
                                uStack_2a04 = auVar176._28_4_;
                                local_2a20[0] = (float)local_2820._0_4_ * fVar245;
                                local_2a20[1] = (float)local_2820._4_4_ * fVar220;
                                local_2a20[2] = fStack_2818 * fVar17;
                                local_2a20[3] = fStack_2814 * fVar18;
                                fStack_2a10 = fStack_2810 * fVar19;
                                fStack_2a0c = fStack_280c * fVar20;
                                fStack_2a08 = fStack_2808 * fVar21;
                                local_2a00[0] = fVar255 * (float)local_2820._0_4_;
                                local_2a00[1] = fVar256 * (float)local_2820._4_4_;
                                local_2a00[2] = fVar259 * fStack_2818;
                                local_2a00[3] = fVar260 * fStack_2814;
                                fStack_29f0 = fVar261 * fStack_2810;
                                fStack_29ec = fVar262 * fStack_280c;
                                fStack_29e8 = fVar263 * fStack_2808;
                                uStack_29e4 = uStack_2a04;
                                local_29e0[0] = (float)local_2820._0_4_ * fVar138;
                                local_29e0[1] = (float)local_2820._4_4_ * fVar153;
                                local_29e0[2] = fStack_2818 * fVar222;
                                local_29e0[3] = fStack_2814 * fVar224;
                                fStack_29d0 = fStack_2810 * fVar226;
                                fStack_29cc = fStack_280c * fVar228;
                                fStack_29c8 = fStack_2808 * fVar230;
                                uStack_29c4 = uStack_2a04;
                                auVar128._0_4_ =
                                     (float)(int)(*(ushort *)(local_2df0 + 8 + local_2df8) - 1);
                                auVar128._4_12_ = auVar196._4_12_;
                                auVar129 = vblendvps_avx(local_2780,auVar129,local_2800);
                                auVar110 = vrcpss_avx(auVar128,auVar128);
                                auVar193._0_4_ =
                                     (float)(int)(*(ushort *)(local_2df0 + 10 + local_2df8) - 1);
                                auVar193._4_12_ = auVar196._4_12_;
                                auVar161 = vrcpss_avx(auVar193,auVar193);
                                auVar110 = ZEXT416((uint)(auVar110._0_4_ *
                                                         (2.0 - auVar110._0_4_ * auVar128._0_4_)));
                                auVar110 = vshufps_avx(auVar110,auVar110,0);
                                local_2b20[0] =
                                     (local_2ea0._0_4_ * (float)local_27a0._0_4_ + auVar114._0_4_) *
                                     auVar110._0_4_;
                                local_2b20[1] =
                                     (local_2ea0._4_4_ * (float)local_27a0._4_4_ + auVar114._4_4_) *
                                     auVar110._4_4_;
                                local_2b20[2] =
                                     (local_2ea0._8_4_ * fStack_2798 + auVar114._8_4_) *
                                     auVar110._8_4_;
                                fStack_2b04 = auVar110._12_4_;
                                local_2b20[3] =
                                     (local_2ea0._12_4_ * fStack_2794 + auVar114._12_4_) *
                                     fStack_2b04;
                                fStack_2b10 = (local_2ea0._16_4_ * fStack_2790 + auVar114._16_4_) *
                                              auVar110._0_4_;
                                fStack_2b0c = (local_2ea0._20_4_ * fStack_278c + auVar114._20_4_) *
                                              auVar110._4_4_;
                                fStack_2b08 = (local_2ea0._24_4_ * fStack_2788 + auVar114._24_4_) *
                                              auVar110._8_4_;
                                auVar110 = ZEXT416((uint)(auVar161._0_4_ *
                                                         (2.0 - auVar161._0_4_ * auVar193._0_4_)));
                                auVar110 = vshufps_avx(auVar110,auVar110,0);
                                fVar211 = (local_2ea0._0_4_ * (float)local_27c0._0_4_ +
                                          auVar129._0_4_) * auVar110._0_4_;
                                fVar154 = (local_2ea0._4_4_ * (float)local_27c0._4_4_ +
                                          auVar129._4_4_) * auVar110._4_4_;
                                local_2b00._4_4_ = fVar154;
                                local_2b00._0_4_ = fVar211;
                                fVar155 = (local_2ea0._8_4_ * fStack_27b8 + auVar129._8_4_) *
                                          auVar110._8_4_;
                                local_2b00._8_4_ = fVar155;
                                fVar156 = (local_2ea0._12_4_ * fStack_27b4 + auVar129._12_4_) *
                                          auVar110._12_4_;
                                local_2b00._12_4_ = fVar156;
                                fVar157 = (local_2ea0._16_4_ * fStack_27b0 + auVar129._16_4_) *
                                          auVar110._0_4_;
                                local_2b00._16_4_ = fVar157;
                                fVar158 = (local_2ea0._20_4_ * fStack_27ac + auVar129._20_4_) *
                                          auVar110._4_4_;
                                local_2b00._20_4_ = fVar158;
                                fVar159 = (local_2ea0._24_4_ * fStack_27a8 + auVar129._24_4_) *
                                          auVar110._8_4_;
                                local_2b00._24_4_ = fVar159;
                                local_2b00._28_4_ = auVar114._28_4_ + 0.0 + auVar129._28_4_;
                                auVar152 = ZEXT3264(local_2b00);
                                pGVar2 = (local_2de8->geometries).items[local_2e00].ptr;
                                local_2dc0 = (undefined1 (*) [16])CONCAT44(fStack_2db8,fStack_2db8);
                                if ((pGVar2->mask & *(uint *)(local_2e20 + lVar98 * 4 + 0x120)) != 0
                                   ) {
                                  if ((local_2e18->args->filter == (RTCFilterFunctionN)0x0) &&
                                     (pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00f5303f:
                                    *(undefined4 *)(local_2d00 + lVar98 * 4) = 0;
                                    auVar166 = local_2ea0;
                                  }
                                  else {
                                    auVar114 = vrcpps_avx(local_2ea0);
                                    fVar183 = auVar114._0_4_;
                                    fVar184 = auVar114._4_4_;
                                    auVar73._4_4_ = local_2ea0._4_4_ * fVar184;
                                    auVar73._0_4_ = local_2ea0._0_4_ * fVar183;
                                    fVar185 = auVar114._8_4_;
                                    auVar73._8_4_ = local_2ea0._8_4_ * fVar185;
                                    fVar186 = auVar114._12_4_;
                                    auVar73._12_4_ = local_2ea0._12_4_ * fVar186;
                                    fVar187 = auVar114._16_4_;
                                    auVar73._16_4_ = local_2ea0._16_4_ * fVar187;
                                    fVar188 = auVar114._20_4_;
                                    auVar73._20_4_ = local_2ea0._20_4_ * fVar188;
                                    fVar8 = auVar114._24_4_;
                                    auVar73._24_4_ = local_2ea0._24_4_ * fVar8;
                                    auVar73._28_4_ = local_2ea0._28_4_;
                                    auVar201._8_4_ = 0x3f800000;
                                    auVar201._0_8_ = 0x3f8000003f800000;
                                    auVar201._12_4_ = 0x3f800000;
                                    auVar201._16_4_ = 0x3f800000;
                                    auVar201._20_4_ = 0x3f800000;
                                    auVar201._24_4_ = 0x3f800000;
                                    auVar201._28_4_ = 0x3f800000;
                                    auVar129 = vsubps_avx(auVar201,auVar73);
                                    auVar124._0_4_ = fVar183 + fVar183 * auVar129._0_4_;
                                    auVar124._4_4_ = fVar184 + fVar184 * auVar129._4_4_;
                                    auVar124._8_4_ = fVar185 + fVar185 * auVar129._8_4_;
                                    auVar124._12_4_ = fVar186 + fVar186 * auVar129._12_4_;
                                    auVar124._16_4_ = fVar187 + fVar187 * auVar129._16_4_;
                                    auVar124._20_4_ = fVar188 + fVar188 * auVar129._20_4_;
                                    auVar124._24_4_ = fVar8 + fVar8 * auVar129._24_4_;
                                    auVar124._28_4_ = auVar114._28_4_ + auVar129._28_4_;
                                    auVar182._8_4_ = 0x219392ef;
                                    auVar182._0_8_ = 0x219392ef219392ef;
                                    auVar182._12_4_ = 0x219392ef;
                                    auVar182._16_4_ = 0x219392ef;
                                    auVar182._20_4_ = 0x219392ef;
                                    auVar182._24_4_ = 0x219392ef;
                                    auVar182._28_4_ = 0x219392ef;
                                    auVar114 = vcmpps_avx(local_27e0,auVar182,5);
                                    auVar114 = vandps_avx(auVar114,auVar124);
                                    auVar74._4_4_ = local_2b20[1] * auVar114._4_4_;
                                    auVar74._0_4_ = local_2b20[0] * auVar114._0_4_;
                                    auVar74._8_4_ = local_2b20[2] * auVar114._8_4_;
                                    auVar74._12_4_ = local_2b20[3] * auVar114._12_4_;
                                    auVar74._16_4_ = fStack_2b10 * auVar114._16_4_;
                                    auVar74._20_4_ = fStack_2b0c * auVar114._20_4_;
                                    auVar74._24_4_ = fStack_2b08 * auVar114._24_4_;
                                    auVar74._28_4_ = fStack_2b04;
                                    local_2a80 = vminps_avx(auVar74,auVar201);
                                    auVar75._4_4_ = fVar154 * auVar114._4_4_;
                                    auVar75._0_4_ = fVar211 * auVar114._0_4_;
                                    auVar75._8_4_ = fVar155 * auVar114._8_4_;
                                    auVar75._12_4_ = fVar156 * auVar114._12_4_;
                                    auVar75._16_4_ = fVar157 * auVar114._16_4_;
                                    auVar75._20_4_ = fVar158 * auVar114._20_4_;
                                    auVar75._24_4_ = fVar159 * auVar114._24_4_;
                                    auVar75._28_4_ = auVar114._28_4_;
                                    local_2a60 = vminps_avx(auVar75,auVar201);
                                    auVar111 = vpacksswb_avx(auVar111,auVar111);
                                    bVar22 = SUB161(auVar111 >> 7,0) & 1 |
                                             (SUB161(auVar111 >> 0xf,0) & 1) << 1 |
                                             (SUB161(auVar111 >> 0x17,0) & 1) << 2 |
                                             (SUB161(auVar111 >> 0x1f,0) & 1) << 3 |
                                             (SUB161(auVar111 >> 0x27,0) & 1) << 4 |
                                             (SUB161(auVar111 >> 0x2f,0) & 1) << 5 |
                                             (SUB161(auVar111 >> 0x37,0) & 1) << 6 |
                                             SUB161(auVar111 >> 0x3f,0) << 7;
                                    uVar103 = (ulong)bVar22;
                                    uVar93 = 0;
                                    if (uVar103 != 0) {
                                      for (; (bVar22 >> uVar93 & 1) == 0; uVar93 = uVar93 + 1) {
                                      }
                                    }
                                    uVar96 = 1 << ((byte)lVar98 & 0x1f);
                                    local_2ea0._0_8_ = mm_lookupmask_ps + ((uVar96 & 0xf) << 4);
                                    local_2dc0 = (undefined1 (*) [16])
                                                 (mm_lookupmask_ps + (long)((int)uVar96 >> 4) * 0x10
                                                 );
                                    local_2d40 = auVar237;
                                    while (auVar166 = local_2ea0, uVar103 != 0) {
                                      local_2960 = *(undefined4 *)(local_2a80 + uVar93 * 4);
                                      local_2940 = *(undefined4 *)(local_2a60 + uVar93 * 4);
                                      *(float *)(pRVar90 + lVar98 * 4 + 0x100) =
                                           local_2a20[uVar93 - 8];
                                      local_2d90.context = pRVar91->user;
                                      local_29c0[0] = local_2a20[uVar93];
                                      local_29a0 = local_2a00[uVar93];
                                      fVar211 = local_29e0[uVar93];
                                      local_2980._4_4_ = fVar211;
                                      local_2980._0_4_ = fVar211;
                                      local_2980._8_4_ = fVar211;
                                      local_2980._12_4_ = fVar211;
                                      local_2980._16_4_ = fVar211;
                                      local_2980._20_4_ = fVar211;
                                      local_2980._24_4_ = fVar211;
                                      local_2980._28_4_ = fVar211;
                                      local_29c0[1] = local_29c0[0];
                                      local_29c0[2] = local_29c0[0];
                                      local_29c0[3] = local_29c0[0];
                                      fStack_29b0 = local_29c0[0];
                                      fStack_29ac = local_29c0[0];
                                      fStack_29a8 = local_29c0[0];
                                      fStack_29a4 = local_29c0[0];
                                      fStack_299c = local_29a0;
                                      fStack_2998 = local_29a0;
                                      fStack_2994 = local_29a0;
                                      fStack_2990 = local_29a0;
                                      fStack_298c = local_29a0;
                                      fStack_2988 = local_29a0;
                                      fStack_2984 = local_29a0;
                                      uStack_295c = local_2960;
                                      uStack_2958 = local_2960;
                                      uStack_2954 = local_2960;
                                      uStack_2950 = local_2960;
                                      uStack_294c = local_2960;
                                      uStack_2948 = local_2960;
                                      uStack_2944 = local_2960;
                                      uStack_293c = local_2940;
                                      uStack_2938 = local_2940;
                                      uStack_2934 = local_2940;
                                      uStack_2930 = local_2940;
                                      uStack_292c = local_2940;
                                      uStack_2928 = local_2940;
                                      uStack_2924 = local_2940;
                                      local_2920 = local_2880._0_8_;
                                      uStack_2918 = local_2880._8_8_;
                                      uStack_2910 = local_2880._16_8_;
                                      uStack_2908 = local_2880._24_8_;
                                      local_2900 = local_2860;
                                      vcmpps_avx(local_2860,local_2860,0xf);
                                      uStack_28dc = (local_2d90.context)->instID[0];
                                      local_28e0 = uStack_28dc;
                                      uStack_28d8 = uStack_28dc;
                                      uStack_28d4 = uStack_28dc;
                                      uStack_28d0 = uStack_28dc;
                                      uStack_28cc = uStack_28dc;
                                      uStack_28c8 = uStack_28dc;
                                      uStack_28c4 = uStack_28dc;
                                      uStack_28bc = (local_2d90.context)->instPrimID[0];
                                      local_28c0 = uStack_28bc;
                                      uStack_28b8 = uStack_28bc;
                                      uStack_28b4 = uStack_28bc;
                                      uStack_28b0 = uStack_28bc;
                                      uStack_28ac = uStack_28bc;
                                      uStack_28a8 = uStack_28bc;
                                      uStack_28a4 = uStack_28bc;
                                      local_2de0 = *(undefined1 (*) [16])local_2ea0._0_8_;
                                      local_2dd0 = *local_2dc0;
                                      local_2d90.valid = (int *)local_2de0;
                                      local_2d90.geometryUserPtr = pGVar2->userPtr;
                                      local_2d90.ray = (RTCRayN *)pRVar90;
                                      local_2d90.hit = (RTCHitN *)local_29c0;
                                      local_2d90.N = 8;
                                      if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                        local_2f00._0_8_ = uVar93;
                                        local_2ee0 = uVar103;
                                        (*pGVar2->occlusionFilterN)(&local_2d90);
                                        auVar136 = ZEXT3264(local_2d40);
                                        lVar98 = local_2ec0._0_8_;
                                        uVar103 = local_2ee0;
                                        uVar93 = local_2f00._0_8_;
                                      }
                                      auVar111 = vpcmpeqd_avx(local_2de0,ZEXT816(0) << 0x40);
                                      auVar110 = vpcmpeqd_avx(local_2dd0,ZEXT816(0) << 0x40);
                                      auVar149._16_16_ = auVar110;
                                      auVar149._0_16_ = auVar111;
                                      auVar114 = vcmpps_avx(ZEXT1632(auVar110),ZEXT1632(auVar110),
                                                            0xf);
                                      auVar129 = auVar114 & ~auVar149;
                                      if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0 &&
                                               (auVar129 >> 0x3f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar129 >> 0x5f & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             SUB321(auVar129 >> 0x7f,0) == '\0') &&
                                            (auVar129 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) &&
                                           SUB321(auVar129 >> 0xbf,0) == '\0') &&
                                          (auVar129 & (undefined1  [32])0x100000000) ==
                                          (undefined1  [32])0x0) && -1 < auVar129[0x1f]) {
                                        auVar125._0_4_ = auVar111._0_4_ ^ auVar114._0_4_;
                                        auVar125._4_4_ = auVar111._4_4_ ^ auVar114._4_4_;
                                        auVar125._8_4_ = auVar111._8_4_ ^ auVar114._8_4_;
                                        auVar125._12_4_ = auVar111._12_4_ ^ auVar114._12_4_;
                                        auVar125._16_4_ = auVar110._0_4_ ^ auVar114._16_4_;
                                        auVar125._20_4_ = auVar110._4_4_ ^ auVar114._20_4_;
                                        auVar125._24_4_ = auVar110._8_4_ ^ auVar114._24_4_;
                                        auVar125._28_4_ = auVar110._12_4_ ^ auVar114._28_4_;
                                      }
                                      else {
                                        p_Var7 = pRVar91->args->filter;
                                        if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                           (((pRVar91->args->flags &
                                             RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                            (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                                          local_2f00._0_8_ = uVar93;
                                          local_2ee0 = uVar103;
                                          (*p_Var7)(&local_2d90);
                                          auVar136 = ZEXT3264(local_2d40);
                                          lVar98 = local_2ec0._0_8_;
                                          uVar103 = local_2ee0;
                                          uVar93 = local_2f00._0_8_;
                                        }
                                        auVar111 = vpcmpeqd_avx(local_2de0,ZEXT816(0) << 0x40);
                                        auVar110 = vpcmpeqd_avx(local_2dd0,ZEXT816(0) << 0x40);
                                        auVar134._16_16_ = auVar110;
                                        auVar134._0_16_ = auVar111;
                                        auVar125._0_8_ = auVar111._0_8_ ^ 0xffffffffffffffff;
                                        auVar125._8_4_ = auVar111._8_4_ ^ 0xffffffff;
                                        auVar125._12_4_ = auVar111._12_4_ ^ 0xffffffff;
                                        auVar125._16_4_ = auVar110._0_4_ ^ 0xffffffff;
                                        auVar125._20_4_ = auVar110._4_4_ ^ 0xffffffff;
                                        auVar125._24_4_ = auVar110._8_4_ ^ 0xffffffff;
                                        auVar125._28_4_ = auVar110._12_4_ ^ 0xffffffff;
                                        auVar149._8_4_ = 0xff800000;
                                        auVar149._0_8_ = 0xff800000ff800000;
                                        auVar149._12_4_ = 0xff800000;
                                        auVar149._16_4_ = 0xff800000;
                                        auVar149._20_4_ = 0xff800000;
                                        auVar149._24_4_ = 0xff800000;
                                        auVar149._28_4_ = 0xff800000;
                                        auVar114 = vblendvps_avx(auVar149,*(undefined1 (*) [32])
                                                                           (local_2d90.ray + 0x100),
                                                                 auVar134);
                                        *(undefined1 (*) [32])(local_2d90.ray + 0x100) = auVar114;
                                      }
                                      auVar152 = ZEXT3264(auVar149);
                                      if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0 ||
                                               (auVar125 >> 0x3f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar125 >> 0x5f & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             SUB321(auVar125 >> 0x7f,0) != '\0') ||
                                            (auVar125 & (undefined1  [32])0x100000000) !=
                                            (undefined1  [32])0x0) ||
                                           SUB321(auVar125 >> 0xbf,0) != '\0') ||
                                          (auVar125 & (undefined1  [32])0x100000000) !=
                                          (undefined1  [32])0x0) || auVar125[0x1f] < '\0')
                                      goto LAB_00f5303f;
                                      *(int *)(local_2f10 + lVar98 * 4) = auVar136._0_4_;
                                      uVar103 = uVar103 ^ 1L << (uVar93 & 0x3f);
                                      uVar93 = 0;
                                      if (uVar103 != 0) {
                                        for (; (uVar103 >> uVar93 & 1) == 0; uVar93 = uVar93 + 1) {
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                          local_2ea0 = auVar166;
                          lVar98 = local_2f08;
                          unaff_RBX = uVar102;
                          pauVar104 = local_2f40;
                          NVar105.ptr = local_2f38.ptr;
                          puVar107 = puVar89;
                          ray = pRVar90;
                          context = pRVar91;
                          uVar93 = local_2d20._0_8_;
                        }
                        auVar114 = local_2d60 & local_2d00;
                        bVar108 = (((((((auVar114 >> 0x1f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar114 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar114 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar114 >> 0x7f,0) == '\0')
                                    && (auVar114 & (undefined1  [32])0x100000000) ==
                                       (undefined1  [32])0x0) && SUB321(auVar114 >> 0xbf,0) == '\0')
                                  && (auVar114 & (undefined1  [32])0x100000000) ==
                                     (undefined1  [32])0x0) && -1 < auVar114[0x1f];
                        local_2d60 = vandps_avx(local_2d00,local_2d60);
                        in_R11 = 0;
                        auVar114 = local_2d00;
                      }
                      auVar136 = ZEXT3264(auVar114);
                    } while ((!bVar108) && (uVar93 = local_2e28 & local_2e28 - 1, uVar93 != 0));
                  }
                  uVar96 = local_2d60._0_4_;
                  uVar76 = local_2d60._4_4_;
                  uVar77 = local_2d60._8_4_;
                  uVar78 = local_2d60._12_4_;
                  uVar79 = local_2d60._16_4_;
                  uVar80 = local_2d60._20_4_;
                  uVar81 = local_2d60._24_4_;
                  uVar82 = local_2d60._28_4_;
                  lVar98 = local_2e30 + 1;
                }
                auVar114 = vcmpps_avx(auVar136._0_32_,auVar136._0_32_,0xf);
                auVar126._0_4_ = uVar96 ^ auVar114._0_4_;
                auVar126._4_4_ = uVar76 ^ auVar114._4_4_;
                auVar126._8_4_ = uVar77 ^ auVar114._8_4_;
                auVar126._12_4_ = uVar78 ^ auVar114._12_4_;
                auVar126._16_4_ = uVar79 ^ auVar114._16_4_;
                auVar126._20_4_ = uVar80 ^ auVar114._20_4_;
                auVar126._24_4_ = uVar81 ^ auVar114._24_4_;
                auVar126._28_4_ = uVar82 ^ auVar114._28_4_;
                _local_2e80 = vorps_avx(auVar126,_local_2e80);
                auVar111 = vpcmpeqd_avx(auVar152._0_16_,auVar152._0_16_);
                auVar110 = vpcmpgtd_avx(local_2e80._16_16_,auVar111);
                auVar111 = vpcmpgtd_avx(local_2e80._0_16_,auVar111);
                auVar111 = vpor_avx(auVar111,auVar110);
                if ((((auVar111 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar111 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar111 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar111[0xf]) goto LAB_00f53523;
                auVar150._8_4_ = 0xff800000;
                auVar150._0_8_ = 0xff800000ff800000;
                auVar150._12_4_ = 0xff800000;
                auVar150._16_4_ = 0xff800000;
                auVar150._20_4_ = 0xff800000;
                auVar150._24_4_ = 0xff800000;
                auVar150._28_4_ = 0xff800000;
                auVar152 = ZEXT3264(auVar150);
                local_2b40 = vblendvps_avx(local_2b40,auVar150,_local_2e80);
              }
              goto LAB_00f51dd0;
            }
            uVar93 = local_2f38.ptr & 0xfffffffffffffff0;
            local_2d20 = vcmpps_avx(local_2b40,auVar136._0_32_,6);
            local_2f38.ptr = 8;
            auVar136 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            for (lVar98 = -0x10;
                (auVar114 = auVar136._0_32_, lVar98 != 0 &&
                (uVar102 = *(ulong *)(uVar93 + 0x20 + lVar98 * 2), uVar102 != 8));
                lVar98 = lVar98 + 4) {
              fVar211 = *(float *)(uVar93 + 0x90 + lVar98);
              fVar154 = *(float *)(uVar93 + 0x30 + lVar98);
              auVar129 = *(undefined1 (*) [32])(ray + 0xe0);
              fVar157 = auVar129._0_4_;
              fVar158 = auVar129._4_4_;
              fVar159 = auVar129._8_4_;
              fVar183 = auVar129._12_4_;
              fVar184 = auVar129._16_4_;
              fVar185 = auVar129._20_4_;
              fVar186 = auVar129._24_4_;
              fVar155 = *(float *)(uVar93 + 0xb0 + lVar98);
              auVar144._0_4_ = fVar157 * fVar211 + fVar154;
              auVar144._4_4_ = fVar158 * fVar211 + fVar154;
              auVar144._8_4_ = fVar159 * fVar211 + fVar154;
              auVar144._12_4_ = fVar183 * fVar211 + fVar154;
              auVar144._16_4_ = fVar184 * fVar211 + fVar154;
              auVar144._20_4_ = fVar185 * fVar211 + fVar154;
              auVar144._24_4_ = fVar186 * fVar211 + fVar154;
              auVar144._28_4_ = fVar211 + fVar154;
              fVar211 = *(float *)(uVar93 + 0x50 + lVar98);
              fVar154 = *(float *)(uVar93 + 0xd0 + lVar98);
              fVar156 = *(float *)(uVar93 + 0x70 + lVar98);
              auVar167._0_4_ = fVar157 * fVar155 + fVar211;
              auVar167._4_4_ = fVar158 * fVar155 + fVar211;
              auVar167._8_4_ = fVar159 * fVar155 + fVar211;
              auVar167._12_4_ = fVar183 * fVar155 + fVar211;
              auVar167._16_4_ = fVar184 * fVar155 + fVar211;
              auVar167._20_4_ = fVar185 * fVar155 + fVar211;
              auVar167._24_4_ = fVar186 * fVar155 + fVar211;
              auVar167._28_4_ = fVar155 + fVar211;
              fVar211 = *(float *)(uVar93 + 0xa0 + lVar98);
              auVar177._0_4_ = fVar157 * fVar154 + fVar156;
              auVar177._4_4_ = fVar158 * fVar154 + fVar156;
              auVar177._8_4_ = fVar159 * fVar154 + fVar156;
              auVar177._12_4_ = fVar183 * fVar154 + fVar156;
              auVar177._16_4_ = fVar184 * fVar154 + fVar156;
              auVar177._20_4_ = fVar185 * fVar154 + fVar156;
              auVar177._24_4_ = fVar186 * fVar154 + fVar156;
              auVar177._28_4_ = fVar155 + fVar156;
              fVar154 = *(float *)(uVar93 + 0x40 + lVar98);
              fVar155 = *(float *)(uVar93 + 0xc0 + lVar98);
              fVar156 = *(float *)(uVar93 + 0x60 + lVar98);
              auVar197._0_4_ = fVar157 * fVar211 + fVar154;
              auVar197._4_4_ = fVar158 * fVar211 + fVar154;
              auVar197._8_4_ = fVar159 * fVar211 + fVar154;
              auVar197._12_4_ = fVar183 * fVar211 + fVar154;
              auVar197._16_4_ = fVar184 * fVar211 + fVar154;
              auVar197._20_4_ = fVar185 * fVar211 + fVar154;
              auVar197._24_4_ = fVar186 * fVar211 + fVar154;
              auVar197._28_4_ = fVar211 + fVar154;
              fVar211 = *(float *)(uVar93 + 0xe0 + lVar98);
              auVar207._0_4_ = fVar156 + fVar157 * fVar155;
              auVar207._4_4_ = fVar156 + fVar158 * fVar155;
              auVar207._8_4_ = fVar156 + fVar159 * fVar155;
              auVar207._12_4_ = fVar156 + fVar183 * fVar155;
              auVar207._16_4_ = fVar156 + fVar184 * fVar155;
              auVar207._20_4_ = fVar156 + fVar185 * fVar155;
              auVar207._24_4_ = fVar156 + fVar186 * fVar155;
              auVar207._28_4_ = fVar156 + fVar154;
              fVar154 = *(float *)(uVar93 + 0x80 + lVar98);
              auVar218._0_4_ = fVar154 + fVar157 * fVar211;
              auVar218._4_4_ = fVar154 + fVar158 * fVar211;
              auVar218._8_4_ = fVar154 + fVar159 * fVar211;
              auVar218._12_4_ = fVar154 + fVar183 * fVar211;
              auVar218._16_4_ = fVar154 + fVar184 * fVar211;
              auVar218._20_4_ = fVar154 + fVar185 * fVar211;
              auVar218._24_4_ = fVar154 + fVar186 * fVar211;
              auVar218._28_4_ = fVar154 + fVar211;
              auVar83._8_8_ = local_2ce0._8_8_;
              auVar83._0_8_ = local_2ce0._0_8_;
              auVar83._16_8_ = local_2ce0._16_8_;
              auVar83._24_8_ = local_2ce0._24_8_;
              auVar85._8_8_ = local_2ce0._40_8_;
              auVar85._0_8_ = local_2ce0._32_8_;
              auVar85._16_8_ = local_2ce0._48_8_;
              auVar85._24_8_ = local_2ce0._56_8_;
              auVar87._8_8_ = local_2ce0._72_8_;
              auVar87._0_8_ = local_2ce0._64_8_;
              auVar87._16_8_ = local_2ce0._80_8_;
              auVar87._24_8_ = local_2ce0._88_8_;
              auVar165 = vsubps_avx(auVar144,auVar83);
              auVar139._0_4_ = (float)local_2c20._0_4_ * auVar165._0_4_;
              auVar139._4_4_ = (float)local_2c20._4_4_ * auVar165._4_4_;
              auVar139._8_4_ = fStack_2c18 * auVar165._8_4_;
              auVar139._12_4_ = fStack_2c14 * auVar165._12_4_;
              auVar23._16_4_ = fStack_2c10 * auVar165._16_4_;
              auVar23._0_16_ = auVar139;
              auVar23._20_4_ = fStack_2c0c * auVar165._20_4_;
              auVar23._24_4_ = fStack_2c08 * auVar165._24_4_;
              auVar23._28_4_ = auVar165._28_4_;
              auVar165 = vsubps_avx(auVar167,auVar85);
              auVar160._0_4_ = (float)local_2c00._0_4_ * auVar165._0_4_;
              auVar160._4_4_ = (float)local_2c00._4_4_ * auVar165._4_4_;
              auVar160._8_4_ = fStack_2bf8 * auVar165._8_4_;
              auVar160._12_4_ = fStack_2bf4 * auVar165._12_4_;
              auVar24._16_4_ = fStack_2bf0 * auVar165._16_4_;
              auVar24._0_16_ = auVar160;
              auVar24._20_4_ = fStack_2bec * auVar165._20_4_;
              auVar24._24_4_ = fStack_2be8 * auVar165._24_4_;
              auVar24._28_4_ = auVar165._28_4_;
              auVar165 = vsubps_avx(auVar177,auVar87);
              auVar172._0_4_ = (float)local_2be0._0_4_ * auVar165._0_4_;
              auVar172._4_4_ = (float)local_2be0._4_4_ * auVar165._4_4_;
              auVar172._8_4_ = fStack_2bd8 * auVar165._8_4_;
              auVar172._12_4_ = fStack_2bd4 * auVar165._12_4_;
              auVar25._16_4_ = fStack_2bd0 * auVar165._16_4_;
              auVar25._0_16_ = auVar172;
              auVar25._20_4_ = fStack_2bcc * auVar165._20_4_;
              auVar25._24_4_ = fStack_2bc8 * auVar165._24_4_;
              auVar25._28_4_ = auVar165._28_4_;
              auVar165 = vsubps_avx(auVar197,auVar83);
              auVar189._0_4_ = (float)local_2c20._0_4_ * auVar165._0_4_;
              auVar189._4_4_ = (float)local_2c20._4_4_ * auVar165._4_4_;
              auVar189._8_4_ = fStack_2c18 * auVar165._8_4_;
              auVar189._12_4_ = fStack_2c14 * auVar165._12_4_;
              auVar26._16_4_ = fStack_2c10 * auVar165._16_4_;
              auVar26._0_16_ = auVar189;
              auVar26._20_4_ = fStack_2c0c * auVar165._20_4_;
              auVar26._24_4_ = fStack_2c08 * auVar165._24_4_;
              auVar26._28_4_ = auVar165._28_4_;
              auVar165 = vsubps_avx(auVar207,auVar85);
              auVar203._0_4_ = (float)local_2c00._0_4_ * auVar165._0_4_;
              auVar203._4_4_ = (float)local_2c00._4_4_ * auVar165._4_4_;
              auVar203._8_4_ = fStack_2bf8 * auVar165._8_4_;
              auVar203._12_4_ = fStack_2bf4 * auVar165._12_4_;
              auVar27._16_4_ = fStack_2bf0 * auVar165._16_4_;
              auVar27._0_16_ = auVar203;
              auVar27._20_4_ = fStack_2bec * auVar165._20_4_;
              auVar27._24_4_ = fStack_2be8 * auVar165._24_4_;
              auVar27._28_4_ = auVar165._28_4_;
              auVar165 = vsubps_avx(auVar218,auVar87);
              auVar213._0_4_ = (float)local_2be0._0_4_ * auVar165._0_4_;
              auVar213._4_4_ = (float)local_2be0._4_4_ * auVar165._4_4_;
              auVar213._8_4_ = fStack_2bd8 * auVar165._8_4_;
              auVar213._12_4_ = fStack_2bd4 * auVar165._12_4_;
              auVar28._16_4_ = fStack_2bd0 * auVar165._16_4_;
              auVar28._0_16_ = auVar213;
              auVar28._20_4_ = fStack_2bcc * auVar165._20_4_;
              auVar28._24_4_ = fStack_2bc8 * auVar165._24_4_;
              auVar28._28_4_ = auVar165._28_4_;
              auVar111 = vpminsd_avx(auVar23._16_16_,auVar26._16_16_);
              auVar110 = vpminsd_avx(auVar139,auVar189);
              auVar161 = vpminsd_avx(auVar24._16_16_,auVar27._16_16_);
              auVar111 = vpmaxsd_avx(auVar111,auVar161);
              auVar161 = vpminsd_avx(auVar160,auVar203);
              auVar110 = vpmaxsd_avx(auVar110,auVar161);
              auVar161 = vpminsd_avx(auVar172,auVar213);
              auVar110 = vpmaxsd_avx(auVar110,auVar161);
              auVar161 = vpminsd_avx(auVar25._16_16_,auVar28._16_16_);
              auVar111 = vpmaxsd_avx(auVar111,auVar161);
              auVar161 = vpmaxsd_avx(auVar23._16_16_,auVar26._16_16_);
              auVar109 = vpmaxsd_avx(auVar139,auVar189);
              auVar139 = vpmaxsd_avx(auVar24._16_16_,auVar27._16_16_);
              auVar139 = vpminsd_avx(auVar161,auVar139);
              auVar161 = vpmaxsd_avx(auVar160,auVar203);
              auVar109 = vpminsd_avx(auVar109,auVar161);
              auVar161 = vpmaxsd_avx(auVar172,auVar213);
              auVar161 = vpminsd_avx(auVar109,auVar161);
              auVar140._0_4_ = auVar110._0_4_ * 0.99999964;
              auVar140._4_4_ = auVar110._4_4_ * 0.99999964;
              auVar140._8_4_ = auVar110._8_4_ * 0.99999964;
              auVar140._12_4_ = auVar110._12_4_ * 0.99999964;
              auVar29._16_4_ = auVar111._0_4_ * 0.99999964;
              auVar29._0_16_ = auVar140;
              auVar29._20_4_ = auVar111._4_4_ * 0.99999964;
              auVar29._24_4_ = auVar111._8_4_ * 0.99999964;
              auVar29._28_4_ = 0x3f7ffffa;
              auVar152 = ZEXT3264(auVar29);
              auVar111 = vpmaxsd_avx(auVar25._16_16_,auVar28._16_16_);
              auVar111 = vpminsd_avx(auVar139,auVar111);
              auVar109._0_4_ = auVar161._0_4_ * 1.0000004;
              auVar109._4_4_ = auVar161._4_4_ * 1.0000004;
              auVar109._8_4_ = auVar161._8_4_ * 1.0000004;
              auVar109._12_4_ = auVar161._12_4_ * 1.0000004;
              auVar30._16_4_ = auVar111._0_4_ * 1.0000004;
              auVar30._0_16_ = auVar109;
              auVar30._20_4_ = auVar111._4_4_ * 1.0000004;
              auVar30._24_4_ = auVar111._8_4_ * 1.0000004;
              auVar30._28_4_ = auVar111._12_4_;
              auVar111 = vpmaxsd_avx(auVar140,local_2b60._0_16_);
              auVar110 = vpmaxsd_avx(auVar29._16_16_,local_2b60._16_16_);
              auVar161 = vpminsd_avx(auVar109,local_2b40._0_16_);
              auVar109 = vpminsd_avx(auVar30._16_16_,local_2b40._16_16_);
              auVar168._16_16_ = auVar110;
              auVar168._0_16_ = auVar111;
              auVar115._16_16_ = auVar109;
              auVar115._0_16_ = auVar161;
              auVar165 = vcmpps_avx(auVar168,auVar115,2);
              if ((uVar96 & 7) == 6) {
                uVar101 = *(undefined4 *)(uVar93 + 0xf0 + lVar98);
                auVar118._4_4_ = uVar101;
                auVar118._0_4_ = uVar101;
                auVar118._8_4_ = uVar101;
                auVar118._12_4_ = uVar101;
                auVar118._16_4_ = uVar101;
                auVar118._20_4_ = uVar101;
                auVar118._24_4_ = uVar101;
                auVar118._28_4_ = uVar101;
                auVar166 = vcmpps_avx(auVar118,auVar129,2);
                uVar101 = *(undefined4 *)(uVar93 + 0x100 + lVar98);
                auVar178._4_4_ = uVar101;
                auVar178._0_4_ = uVar101;
                auVar178._8_4_ = uVar101;
                auVar178._12_4_ = uVar101;
                auVar178._16_4_ = uVar101;
                auVar178._20_4_ = uVar101;
                auVar178._24_4_ = uVar101;
                auVar178._28_4_ = uVar101;
                auVar129 = vcmpps_avx(auVar129,auVar178,1);
                auVar129 = vandps_avx(auVar166,auVar129);
                auVar129 = vandps_avx(auVar129,auVar165);
                auVar111 = vpackssdw_avx(auVar129._0_16_,auVar129._16_16_);
              }
              else {
                auVar111 = vpackssdw_avx(auVar165._0_16_,auVar165._16_16_);
              }
              auVar110 = vpackssdw_avx(local_2d20._0_16_,local_2d20._16_16_);
              auVar111 = vpand_avx(auVar111,auVar110);
              auVar110 = vpmovzxwd_avx(auVar111);
              auVar161 = vpslld_avx(auVar110,0x1f);
              auVar110 = vpunpckhwd_avx(auVar111,auVar111);
              auVar110 = vpslld_avx(auVar110,0x1f);
              auVar116._16_16_ = auVar110;
              auVar116._0_16_ = auVar161;
              if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar116 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar116 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar116 >> 0x7f,0) == '\0') &&
                    (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB161(auVar110 >> 0x3f,0) == '\0') &&
                  (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar110[0xf]) {
                auVar137 = ZEXT3264(auVar114);
                uVar102 = local_2f38.ptr;
              }
              else {
                auVar111 = vpunpckhwd_avx(auVar111,auVar111);
                auVar111 = vpslld_avx(auVar111,0x1f);
                auVar117._16_16_ = auVar111;
                auVar117._0_16_ = auVar161;
                auVar131._8_4_ = 0x7f800000;
                auVar131._0_8_ = 0x7f8000007f800000;
                auVar131._12_4_ = 0x7f800000;
                auVar131._16_4_ = 0x7f800000;
                auVar131._20_4_ = 0x7f800000;
                auVar131._24_4_ = 0x7f800000;
                auVar131._28_4_ = 0x7f800000;
                auVar129 = vblendvps_avx(auVar131,auVar29,auVar117);
                auVar137 = ZEXT3264(auVar129);
                if (local_2f38.ptr != 8) {
                  *puVar107 = local_2f38.ptr;
                  puVar107 = puVar107 + 1;
                  local_2ec0._0_8_ = auVar136._0_8_;
                  local_2ec0._8_8_ = auVar136._8_8_;
                  local_2ec0._16_8_ = auVar136._16_8_;
                  local_2ec0._24_8_ = auVar136._24_8_;
                  *(undefined8 *)*pauVar104 = local_2ec0._0_8_;
                  *(undefined8 *)(*pauVar104 + 8) = local_2ec0._8_8_;
                  *(undefined8 *)(*pauVar104 + 0x10) = local_2ec0._16_8_;
                  *(undefined8 *)(*pauVar104 + 0x18) = local_2ec0._24_8_;
                  pauVar104 = pauVar104 + 1;
                }
              }
              local_2f38.ptr = uVar102;
              auVar136 = auVar137;
              local_2ec0 = auVar114;
            }
            if (local_2f38.ptr == 8) goto LAB_00f52198;
            auVar129 = vcmpps_avx(local_2b40,auVar114,6);
            uVar101 = vmovmskps_avx(auVar129);
          } while ((byte)local_2f30 < (byte)POPCOUNT(uVar101));
          *puVar107 = local_2f38.ptr;
          puVar107 = puVar107 + 1;
          *pauVar104 = auVar114;
          pauVar104 = pauVar104 + 1;
LAB_00f52198:
          iVar92 = 4;
          local_2f40 = pauVar104;
          local_2f28 = puVar107;
        }
        else {
          while (local_2ec0 = auVar114, auVar111 = auVar152._0_16_, unaff_RBX != 0) {
            k = 0;
            if (unaff_RBX != 0) {
              for (; (unaff_RBX >> k & 1) == 0; k = k + 1) {
              }
            }
            unaff_RBX = unaff_RBX & unaff_RBX - 1;
            auVar152 = ZEXT1664(auVar111);
            bVar108 = occluded1(local_2e40,local_2e48,local_2f38,k,&local_2f42,ray,
                                (TravRayK<8,_true> *)&local_2ce0.field_0,context);
            auVar114 = local_2ec0;
            if (bVar108) {
              *(undefined4 *)(local_2e80 + k * 4) = 0xffffffff;
            }
          }
          auVar111 = vpcmpeqd_avx(auVar111,auVar111);
          auVar110 = vpcmpgtd_avx(stack0xffffffffffffd190,auVar111);
          auVar111 = vpcmpgtd_avx(local_2e80._0_16_,auVar111);
          auVar152 = ZEXT1664(auVar111);
          auVar111 = vpor_avx(auVar111,auVar110);
          iVar92 = 3;
          if ((((auVar111 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar111 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar111 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar111[0xf] < '\0') {
            auVar151._8_4_ = 0xff800000;
            auVar151._0_8_ = 0xff800000ff800000;
            auVar151._12_4_ = 0xff800000;
            auVar151._16_4_ = 0xff800000;
            auVar151._20_4_ = 0xff800000;
            auVar151._24_4_ = 0xff800000;
            auVar151._28_4_ = 0xff800000;
            auVar152 = ZEXT3264(auVar151);
            local_2b40 = vblendvps_avx(local_2b40,auVar151,_local_2e80);
            iVar92 = 2;
          }
          unaff_RBX = 0;
          puVar107 = local_2f28;
          auVar114 = local_2ec0;
          if ((uint)local_2f30 < (uint)POPCOUNT(uVar101)) goto LAB_00f51e1b;
        }
        pauVar104 = local_2f40;
        puVar107 = local_2f28;
      } while (iVar92 != 3);
LAB_00f53523:
      auVar114 = vandps_avx(local_28a0,_local_2e80);
      auVar135._8_4_ = 0xff800000;
      auVar135._0_8_ = 0xff800000ff800000;
      auVar135._12_4_ = 0xff800000;
      auVar135._16_4_ = 0xff800000;
      auVar135._20_4_ = 0xff800000;
      auVar135._24_4_ = 0xff800000;
      auVar135._28_4_ = 0xff800000;
      auVar114 = vmaskmovps_avx(auVar114,auVar135);
      *(undefined1 (*) [32])local_2f10 = auVar114;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }